

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding.cpp
# Opt level: O3

void ncnn::copy_make_border_image<unsigned_short>
               (Mat *src,Mat *dst,int top,int left,int type,unsigned_short v)

{
  undefined2 uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  undefined2 *puVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  void *pvVar17;
  undefined1 auVar18 [16];
  int iVar28;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 in_XMM1 [16];
  int iVar41;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  long lVar78;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  long lVar120;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 in_XMM6 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 in_XMM7 [16];
  undefined1 auVar145 [16];
  undefined1 in_XMM8 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  int iVar177;
  int iVar178;
  int iVar183;
  undefined1 auVar179 [16];
  int iVar184;
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 in_XMM15 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined2 *local_b0;
  
  auVar81 = _DAT_0055f000;
  auVar176 = _DAT_0055eff0;
  auVar169 = _DAT_00553770;
  auVar155 = _DAT_00553760;
  auVar153 = _DAT_005530d0;
  uVar16 = (ulong)(uint)left;
  uVar2 = dst->w;
  lVar7 = (long)(int)uVar2;
  iVar3 = dst->h;
  local_b0 = (undefined2 *)src->data;
  pvVar17 = dst->data;
  if (type == 0) {
    if (top < 1) {
      auVar81 = in_XMM7;
      iVar178 = 0;
    }
    else {
      lVar10 = (ulong)uVar2 - 1;
      auVar18._8_4_ = (int)lVar10;
      auVar18._0_8_ = lVar10;
      auVar18._12_4_ = (int)((ulong)lVar10 >> 0x20);
      iVar13 = 0;
      auVar18 = auVar18 ^ _DAT_005530d0;
      in_XMM6._8_4_ = 0xffffffff;
      in_XMM6._0_8_ = 0xffffffffffffffff;
      in_XMM6._12_4_ = 0xffffffff;
      do {
        if (0 < (int)uVar2) {
          lVar10 = 0;
          in_XMM8 = auVar169;
          auVar79 = auVar155;
          auVar145 = auVar176;
          auVar146 = _DAT_0055efe0;
          do {
            auVar156 = in_XMM8 ^ auVar153;
            iVar178 = auVar18._0_4_;
            iVar177 = -(uint)(iVar178 < auVar156._0_4_);
            iVar41 = auVar18._4_4_;
            auVar157._4_4_ = -(uint)(iVar41 < auVar156._4_4_);
            iVar184 = auVar18._8_4_;
            iVar183 = -(uint)(iVar184 < auVar156._8_4_);
            iVar28 = auVar18._12_4_;
            auVar157._12_4_ = -(uint)(iVar28 < auVar156._12_4_);
            auVar159._4_4_ = iVar177;
            auVar159._0_4_ = iVar177;
            auVar159._8_4_ = iVar183;
            auVar159._12_4_ = iVar183;
            auVar185 = pshuflw(in_XMM15,auVar159,0xe8);
            auVar158._4_4_ = -(uint)(auVar156._4_4_ == iVar41);
            auVar158._12_4_ = -(uint)(auVar156._12_4_ == iVar28);
            auVar158._0_4_ = auVar158._4_4_;
            auVar158._8_4_ = auVar158._12_4_;
            auVar156 = pshuflw(in_XMM1,auVar158,0xe8);
            auVar157._0_4_ = auVar157._4_4_;
            auVar157._8_4_ = auVar157._12_4_;
            auVar186 = pshuflw(auVar185,auVar157,0xe8);
            auVar156 = (auVar186 | auVar156 & auVar185) ^ in_XMM6;
            auVar156 = packssdw(auVar156,auVar156);
            if ((auVar156 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(unsigned_short *)((long)pvVar17 + lVar10) = v;
            }
            auVar157 = auVar158 & auVar159 | auVar157;
            auVar158 = packssdw(auVar157,auVar157);
            auVar158 = packssdw(auVar158 ^ in_XMM6,auVar158 ^ in_XMM6);
            if ((auVar158._0_4_ >> 0x10 & 1) != 0) {
              *(unsigned_short *)((long)pvVar17 + lVar10 + 2) = v;
            }
            auVar158 = auVar79 ^ auVar153;
            iVar177 = -(uint)(iVar178 < auVar158._0_4_);
            auVar179._4_4_ = -(uint)(iVar41 < auVar158._4_4_);
            iVar183 = -(uint)(iVar184 < auVar158._8_4_);
            auVar179._12_4_ = -(uint)(iVar28 < auVar158._12_4_);
            auVar185._4_4_ = iVar177;
            auVar185._0_4_ = iVar177;
            auVar185._8_4_ = iVar183;
            auVar185._12_4_ = iVar183;
            iVar177 = -(uint)(auVar158._4_4_ == iVar41);
            iVar183 = -(uint)(auVar158._12_4_ == iVar28);
            auVar186._4_4_ = iVar177;
            auVar186._0_4_ = iVar177;
            auVar186._8_4_ = iVar183;
            auVar186._12_4_ = iVar183;
            auVar179._0_4_ = auVar179._4_4_;
            auVar179._8_4_ = auVar179._12_4_;
            auVar158 = auVar186 & auVar185 | auVar179;
            auVar158 = packssdw(auVar158,auVar158);
            auVar158 = packssdw(auVar158 ^ in_XMM6,auVar158 ^ in_XMM6);
            if ((auVar158 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              *(unsigned_short *)((long)pvVar17 + lVar10 + 4) = v;
            }
            auVar158 = pshufhw(auVar158,auVar185,0x84);
            auVar159 = pshufhw(auVar185,auVar186,0x84);
            auVar157 = pshufhw(auVar158,auVar179,0x84);
            auVar158 = (auVar157 | auVar159 & auVar158) ^ in_XMM6;
            auVar158 = packssdw(auVar158,auVar158);
            if ((auVar158 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              *(unsigned_short *)((long)pvVar17 + lVar10 + 6) = v;
            }
            auVar158 = auVar145 ^ auVar153;
            iVar177 = -(uint)(iVar178 < auVar158._0_4_);
            auVar161._4_4_ = -(uint)(iVar41 < auVar158._4_4_);
            iVar183 = -(uint)(iVar184 < auVar158._8_4_);
            auVar161._12_4_ = -(uint)(iVar28 < auVar158._12_4_);
            auVar170._4_4_ = iVar177;
            auVar170._0_4_ = iVar177;
            auVar170._8_4_ = iVar183;
            auVar170._12_4_ = iVar183;
            auVar157 = pshuflw(auVar156,auVar170,0xe8);
            auVar156._0_4_ = -(uint)(auVar158._0_4_ == iVar178);
            auVar156._4_4_ = -(uint)(auVar158._4_4_ == iVar41);
            auVar156._8_4_ = -(uint)(auVar158._8_4_ == iVar184);
            auVar156._12_4_ = -(uint)(auVar158._12_4_ == iVar28);
            auVar160._4_4_ = auVar156._4_4_;
            auVar160._0_4_ = auVar156._4_4_;
            auVar160._8_4_ = auVar156._12_4_;
            auVar160._12_4_ = auVar156._12_4_;
            auVar156 = pshuflw(auVar156,auVar160,0xe8);
            auVar161._0_4_ = auVar161._4_4_;
            auVar161._8_4_ = auVar161._12_4_;
            auVar158 = pshuflw(auVar157,auVar161,0xe8);
            in_XMM15 = (auVar158 | auVar156 & auVar157) ^ in_XMM6;
            auVar156 = packssdw(auVar156 & auVar157,in_XMM15);
            if ((auVar156 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(unsigned_short *)((long)pvVar17 + lVar10 + 8) = v;
            }
            auVar161 = auVar160 & auVar170 | auVar161;
            auVar158 = packssdw(auVar161,auVar161);
            auVar156 = packssdw(auVar156,auVar158 ^ in_XMM6);
            if ((auVar156 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
              *(unsigned_short *)((long)pvVar17 + lVar10 + 10) = v;
            }
            auVar156 = auVar146 ^ auVar153;
            iVar178 = -(uint)(iVar178 < auVar156._0_4_);
            auVar180._4_4_ = -(uint)(iVar41 < auVar156._4_4_);
            iVar184 = -(uint)(iVar184 < auVar156._8_4_);
            auVar180._12_4_ = -(uint)(iVar28 < auVar156._12_4_);
            auVar162._4_4_ = iVar178;
            auVar162._0_4_ = iVar178;
            auVar162._8_4_ = iVar184;
            auVar162._12_4_ = iVar184;
            iVar178 = -(uint)(auVar156._4_4_ == iVar41);
            iVar41 = -(uint)(auVar156._12_4_ == iVar28);
            auVar171._4_4_ = iVar178;
            auVar171._0_4_ = iVar178;
            auVar171._8_4_ = iVar41;
            auVar171._12_4_ = iVar41;
            auVar180._0_4_ = auVar180._4_4_;
            auVar180._8_4_ = auVar180._12_4_;
            auVar156 = auVar171 & auVar162 | auVar180;
            auVar156 = packssdw(auVar156,auVar156);
            auVar156 = packssdw(auVar156 ^ in_XMM6,auVar156 ^ in_XMM6);
            if ((auVar156 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              *(unsigned_short *)((long)pvVar17 + lVar10 + 0xc) = v;
            }
            auVar156 = pshufhw(auVar156,auVar162,0x84);
            auVar157 = pshufhw(auVar162,auVar171,0x84);
            auVar158 = pshufhw(auVar156,auVar180,0x84);
            auVar156 = (auVar158 | auVar157 & auVar156) ^ in_XMM6;
            in_XMM1 = packssdw(auVar156,auVar156);
            if ((in_XMM1 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              *(unsigned_short *)((long)pvVar17 + lVar10 + 0xe) = v;
            }
            lVar8 = auVar81._0_8_;
            lVar15 = in_XMM8._8_8_;
            in_XMM8._0_8_ = in_XMM8._0_8_ + lVar8;
            lVar14 = auVar81._8_8_;
            in_XMM8._8_8_ = lVar15 + lVar14;
            lVar15 = auVar79._8_8_;
            auVar79._0_8_ = auVar79._0_8_ + lVar8;
            auVar79._8_8_ = lVar15 + lVar14;
            lVar15 = auVar145._8_8_;
            auVar145._0_8_ = auVar145._0_8_ + lVar8;
            auVar145._8_8_ = lVar15 + lVar14;
            lVar15 = auVar146._8_8_;
            auVar146._0_8_ = auVar146._0_8_ + lVar8;
            auVar146._8_8_ = lVar15 + lVar14;
            lVar10 = lVar10 + 0x10;
          } while ((ulong)(uVar2 + 7 >> 3) << 4 != lVar10);
        }
        pvVar17 = (void *)((long)pvVar17 + lVar7 * 2);
        iVar13 = iVar13 + 1;
        iVar178 = top;
      } while (iVar13 != top);
    }
    if (iVar178 < src->h + top) {
      lVar10 = (ulong)(uint)left - 1;
      auVar147._8_4_ = (int)lVar10;
      auVar147._0_8_ = lVar10;
      auVar147._12_4_ = (int)((ulong)lVar10 >> 0x20);
      lVar10 = (long)pvVar17 + 0xe;
      auVar147 = auVar147 ^ _DAT_005530d0;
      in_XMM15._8_4_ = 0xffffffff;
      in_XMM15._0_8_ = 0xffffffffffffffff;
      in_XMM15._12_4_ = 0xffffffff;
      auVar153 = _DAT_0055efe0;
      auVar155 = _DAT_0055eff0;
      auVar169 = _DAT_00553760;
      auVar176 = _DAT_00553770;
      auVar18 = _DAT_005530d0;
      do {
        uVar11 = 0;
        if (0 < left) {
          lVar8 = 0;
          auVar19 = auVar176;
          in_XMM1 = auVar169;
          auVar42 = auVar155;
          auVar50 = auVar153;
          do {
            auVar79 = auVar19 ^ auVar18;
            iVar184 = auVar147._0_4_;
            iVar13 = -(uint)(iVar184 < auVar79._0_4_);
            iVar28 = auVar147._4_4_;
            auVar80._4_4_ = -(uint)(iVar28 < auVar79._4_4_);
            iVar177 = auVar147._8_4_;
            iVar41 = -(uint)(iVar177 < auVar79._8_4_);
            iVar183 = auVar147._12_4_;
            auVar80._12_4_ = -(uint)(iVar183 < auVar79._12_4_);
            auVar121._4_4_ = iVar13;
            auVar121._0_4_ = iVar13;
            auVar121._8_4_ = iVar41;
            auVar121._12_4_ = iVar41;
            auVar145 = pshuflw(auVar81,auVar121,0xe8);
            auVar81._4_4_ = -(uint)(auVar79._4_4_ == iVar28);
            auVar81._12_4_ = -(uint)(auVar79._12_4_ == iVar183);
            auVar81._0_4_ = auVar81._4_4_;
            auVar81._8_4_ = auVar81._12_4_;
            auVar146 = pshuflw(in_XMM8,auVar81,0xe8);
            auVar80._0_4_ = auVar80._4_4_;
            auVar80._8_4_ = auVar80._12_4_;
            auVar79 = pshuflw(auVar145,auVar80,0xe8);
            auVar79 = (auVar79 | auVar146 & auVar145) ^ in_XMM15;
            auVar79 = packssdw(auVar79,auVar79);
            if ((auVar79 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(unsigned_short *)((long)pvVar17 + lVar8) = v;
            }
            auVar80 = auVar81 & auVar121 | auVar80;
            auVar81 = packssdw(auVar80,auVar80);
            auVar81 = packssdw(auVar81 ^ in_XMM15,auVar81 ^ in_XMM15);
            if ((auVar81._0_4_ >> 0x10 & 1) != 0) {
              *(unsigned_short *)((long)pvVar17 + lVar8 + 2) = v;
            }
            auVar81 = in_XMM1 ^ auVar18;
            iVar13 = -(uint)(iVar184 < auVar81._0_4_);
            auVar141._4_4_ = -(uint)(iVar28 < auVar81._4_4_);
            iVar41 = -(uint)(iVar177 < auVar81._8_4_);
            auVar141._12_4_ = -(uint)(iVar183 < auVar81._12_4_);
            auVar82._4_4_ = iVar13;
            auVar82._0_4_ = iVar13;
            auVar82._8_4_ = iVar41;
            auVar82._12_4_ = iVar41;
            auVar122._4_4_ = -(uint)(auVar81._4_4_ == iVar28);
            auVar122._12_4_ = -(uint)(auVar81._12_4_ == iVar183);
            auVar122._0_4_ = auVar122._4_4_;
            auVar122._8_4_ = auVar122._12_4_;
            auVar141._0_4_ = auVar141._4_4_;
            auVar141._8_4_ = auVar141._12_4_;
            auVar81 = auVar122 & auVar82 | auVar141;
            auVar81 = packssdw(auVar81,auVar81);
            auVar81 = packssdw(auVar81 ^ in_XMM15,auVar81 ^ in_XMM15);
            if ((auVar81 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              *(unsigned_short *)((long)pvVar17 + lVar8 + 4) = v;
            }
            auVar79 = pshufhw(auVar82,auVar82,0x84);
            auVar158 = pshufhw(auVar122,auVar122,0x84);
            auVar156 = pshufhw(auVar79,auVar141,0x84);
            auVar79 = (auVar156 | auVar158 & auVar79) ^ in_XMM15;
            auVar79 = packssdw(auVar79,auVar79);
            if ((auVar79 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              *(unsigned_short *)((long)pvVar17 + lVar8 + 6) = v;
            }
            auVar79 = auVar42 ^ auVar18;
            iVar13 = -(uint)(iVar184 < auVar79._0_4_);
            auVar84._4_4_ = -(uint)(iVar28 < auVar79._4_4_);
            iVar41 = -(uint)(iVar177 < auVar79._8_4_);
            auVar84._12_4_ = -(uint)(iVar183 < auVar79._12_4_);
            auVar123._4_4_ = iVar13;
            auVar123._0_4_ = iVar13;
            auVar123._8_4_ = iVar41;
            auVar123._12_4_ = iVar41;
            auVar81 = pshuflw(auVar81,auVar123,0xe8);
            auVar83._4_4_ = -(uint)(auVar79._4_4_ == iVar28);
            auVar83._12_4_ = -(uint)(auVar79._12_4_ == iVar183);
            auVar83._0_4_ = auVar83._4_4_;
            auVar83._8_4_ = auVar83._12_4_;
            auVar79 = pshuflw(auVar146 & auVar145,auVar83,0xe8);
            in_XMM8 = auVar79 & auVar81;
            auVar84._0_4_ = auVar84._4_4_;
            auVar84._8_4_ = auVar84._12_4_;
            auVar81 = pshuflw(auVar81,auVar84,0xe8);
            auVar81 = (auVar81 | in_XMM8) ^ in_XMM15;
            auVar81 = packssdw(auVar81,auVar81);
            if ((auVar81 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(unsigned_short *)((long)pvVar17 + lVar8 + 8) = v;
            }
            auVar84 = auVar83 & auVar123 | auVar84;
            auVar81 = packssdw(auVar84,auVar84);
            auVar81 = packssdw(auVar81 ^ in_XMM15,auVar81 ^ in_XMM15);
            if ((auVar81 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
              *(unsigned_short *)((long)pvVar17 + lVar8 + 10) = v;
            }
            auVar81 = auVar50 ^ auVar18;
            iVar13 = -(uint)(iVar184 < auVar81._0_4_);
            in_XMM6._4_4_ = -(uint)(iVar28 < auVar81._4_4_);
            iVar41 = -(uint)(iVar177 < auVar81._8_4_);
            in_XMM6._12_4_ = -(uint)(iVar183 < auVar81._12_4_);
            auVar85._4_4_ = iVar13;
            auVar85._0_4_ = iVar13;
            auVar85._8_4_ = iVar41;
            auVar85._12_4_ = iVar41;
            auVar124._4_4_ = -(uint)(auVar81._4_4_ == iVar28);
            auVar124._12_4_ = -(uint)(auVar81._12_4_ == iVar183);
            auVar124._0_4_ = auVar124._4_4_;
            auVar124._8_4_ = auVar124._12_4_;
            in_XMM6._0_4_ = in_XMM6._4_4_;
            in_XMM6._8_4_ = in_XMM6._12_4_;
            auVar81 = auVar124 & auVar85 | in_XMM6;
            auVar81 = packssdw(auVar81,auVar81);
            auVar81 = packssdw(auVar81 ^ in_XMM15,auVar81 ^ in_XMM15);
            if ((auVar81 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              *(unsigned_short *)((long)pvVar17 + lVar8 + 0xc) = v;
            }
            auVar79 = pshufhw(auVar85,auVar85,0x84);
            auVar146 = pshufhw(auVar124,auVar124,0x84);
            auVar145 = pshufhw(auVar79,in_XMM6,0x84);
            auVar79 = (auVar145 | auVar146 & auVar79) ^ in_XMM15;
            auVar79 = packssdw(auVar79,auVar79);
            if ((auVar79 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              *(unsigned_short *)((long)pvVar17 + lVar8 + 0xe) = v;
            }
            lVar14 = auVar19._8_8_;
            lVar15 = (long)DAT_0055f000;
            auVar19._0_8_ = auVar19._0_8_ + lVar15;
            lVar78 = DAT_0055f000._8_8_;
            auVar19._8_8_ = lVar14 + lVar78;
            lVar14 = in_XMM1._8_8_;
            in_XMM1._0_8_ = in_XMM1._0_8_ + lVar15;
            in_XMM1._8_8_ = lVar14 + lVar78;
            lVar14 = auVar42._8_8_;
            auVar42._0_8_ = auVar42._0_8_ + lVar15;
            auVar42._8_8_ = lVar14 + lVar78;
            lVar14 = auVar50._8_8_;
            auVar50._0_8_ = auVar50._0_8_ + lVar15;
            auVar50._8_8_ = lVar14 + lVar78;
            lVar8 = lVar8 + 0x10;
            uVar11 = uVar16;
          } while ((ulong)(left + 7U >> 3) << 4 != lVar8);
        }
        uVar6 = src->w;
        uVar5 = (uint)uVar11;
        if ((int)uVar6 < 0xc) {
          uVar4 = uVar6 + left;
          if ((int)uVar5 < (int)uVar4) {
            do {
              *(undefined2 *)((long)pvVar17 + uVar11 * 2) = local_b0[uVar11 - (long)left];
              uVar11 = uVar11 + 1;
              uVar5 = uVar4;
            } while (uVar4 != uVar11);
          }
        }
        else {
          memcpy((void *)((long)pvVar17 + (long)left * 2),local_b0,(ulong)uVar6 * 2);
          in_XMM15._8_4_ = 0xffffffff;
          in_XMM15._0_8_ = 0xffffffffffffffff;
          in_XMM15._12_4_ = 0xffffffff;
          uVar6 = src->w;
          auVar153 = _DAT_0055efe0;
          auVar155 = _DAT_0055eff0;
          auVar169 = _DAT_00553760;
          auVar176 = _DAT_00553770;
          auVar18 = _DAT_005530d0;
          uVar5 = uVar5 + uVar6;
        }
        if ((int)uVar5 < (int)uVar2) {
          lVar14 = lVar7 - (int)uVar5;
          lVar8 = lVar14 + -1;
          auVar20._8_4_ = (int)lVar8;
          auVar20._0_8_ = lVar8;
          auVar20._12_4_ = (int)((ulong)lVar8 >> 0x20);
          lVar8 = lVar10 + (long)(int)uVar5 * 2;
          uVar11 = 0;
          do {
            auVar29._8_4_ = (int)uVar11;
            auVar29._0_8_ = uVar11;
            auVar29._12_4_ = (int)(uVar11 >> 0x20);
            auVar79 = auVar20 ^ auVar18;
            auVar145 = (auVar29 | auVar176) ^ auVar18;
            iVar13 = auVar79._0_4_;
            iVar177 = -(uint)(iVar13 < auVar145._0_4_);
            iVar41 = auVar79._4_4_;
            auVar52._4_4_ = -(uint)(iVar41 < auVar145._4_4_);
            iVar184 = auVar79._8_4_;
            iVar183 = -(uint)(iVar184 < auVar145._8_4_);
            iVar28 = auVar79._12_4_;
            auVar52._12_4_ = -(uint)(iVar28 < auVar145._12_4_);
            auVar86._4_4_ = iVar177;
            auVar86._0_4_ = iVar177;
            auVar86._8_4_ = iVar183;
            auVar86._12_4_ = iVar183;
            auVar79 = pshuflw(in_XMM6,auVar86,0xe8);
            auVar51._4_4_ = -(uint)(auVar145._4_4_ == iVar41);
            auVar51._12_4_ = -(uint)(auVar145._12_4_ == iVar28);
            auVar51._0_4_ = auVar51._4_4_;
            auVar51._8_4_ = auVar51._12_4_;
            auVar145 = pshuflw(auVar81,auVar51,0xe8);
            auVar52._0_4_ = auVar52._4_4_;
            auVar52._8_4_ = auVar52._12_4_;
            auVar81 = pshuflw(auVar79,auVar52,0xe8);
            auVar81 = (auVar81 | auVar145 & auVar79) ^ in_XMM15;
            auVar81 = packssdw(auVar81,auVar81);
            if ((auVar81 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(unsigned_short *)(lVar8 + -0xe + uVar11 * 2) = v;
            }
            auVar52 = auVar51 & auVar86 | auVar52;
            auVar81 = packssdw(auVar52,auVar52);
            auVar81 = packssdw(auVar81 ^ in_XMM15,auVar81 ^ in_XMM15);
            if ((auVar81._0_4_ >> 0x10 & 1) != 0) {
              *(unsigned_short *)(lVar8 + -0xc + uVar11 * 2) = v;
            }
            auVar81 = (auVar29 | auVar169) ^ auVar18;
            iVar177 = -(uint)(iVar13 < auVar81._0_4_);
            auVar125._4_4_ = -(uint)(iVar41 < auVar81._4_4_);
            iVar183 = -(uint)(iVar184 < auVar81._8_4_);
            auVar125._12_4_ = -(uint)(iVar28 < auVar81._12_4_);
            auVar53._4_4_ = iVar177;
            auVar53._0_4_ = iVar177;
            auVar53._8_4_ = iVar183;
            auVar53._12_4_ = iVar183;
            auVar87._4_4_ = -(uint)(auVar81._4_4_ == iVar41);
            auVar87._12_4_ = -(uint)(auVar81._12_4_ == iVar28);
            auVar87._0_4_ = auVar87._4_4_;
            auVar87._8_4_ = auVar87._12_4_;
            auVar125._0_4_ = auVar125._4_4_;
            auVar125._8_4_ = auVar125._12_4_;
            auVar81 = auVar87 & auVar53 | auVar125;
            auVar81 = packssdw(auVar81,auVar81);
            auVar81 = packssdw(auVar81 ^ in_XMM15,auVar81 ^ in_XMM15);
            if ((auVar81 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              *(unsigned_short *)(lVar8 + -10 + uVar11 * 2) = v;
            }
            auVar146 = pshufhw(auVar53,auVar53,0x84);
            auVar158 = pshufhw(auVar87,auVar87,0x84);
            auVar156 = pshufhw(auVar146,auVar125,0x84);
            auVar146 = (auVar156 | auVar158 & auVar146) ^ in_XMM15;
            auVar146 = packssdw(auVar146,auVar146);
            if ((auVar146 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              *(unsigned_short *)(lVar8 + -8 + uVar11 * 2) = v;
            }
            auVar146 = (auVar29 | auVar155) ^ auVar18;
            iVar177 = -(uint)(iVar13 < auVar146._0_4_);
            auVar55._4_4_ = -(uint)(iVar41 < auVar146._4_4_);
            iVar183 = -(uint)(iVar184 < auVar146._8_4_);
            auVar55._12_4_ = -(uint)(iVar28 < auVar146._12_4_);
            auVar88._4_4_ = iVar177;
            auVar88._0_4_ = iVar177;
            auVar88._8_4_ = iVar183;
            auVar88._12_4_ = iVar183;
            auVar156 = pshuflw(auVar81,auVar88,0xe8);
            auVar54._4_4_ = -(uint)(auVar146._4_4_ == iVar41);
            auVar54._12_4_ = -(uint)(auVar146._12_4_ == iVar28);
            auVar54._0_4_ = auVar54._4_4_;
            auVar54._8_4_ = auVar54._12_4_;
            auVar81 = pshuflw(auVar145 & auVar79,auVar54,0xe8);
            auVar81 = auVar81 & auVar156;
            auVar55._0_4_ = auVar55._4_4_;
            auVar55._8_4_ = auVar55._12_4_;
            auVar79 = pshuflw(auVar156,auVar55,0xe8);
            auVar79 = (auVar79 | auVar81) ^ in_XMM15;
            in_XMM6 = packssdw(auVar79,auVar79);
            if ((in_XMM6 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(unsigned_short *)(lVar8 + -6 + uVar11 * 2) = v;
            }
            auVar55 = auVar54 & auVar88 | auVar55;
            auVar79 = packssdw(auVar55,auVar55);
            auVar79 = packssdw(auVar79 ^ in_XMM15,auVar79 ^ in_XMM15);
            if ((auVar79 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
              *(unsigned_short *)(lVar8 + -4 + uVar11 * 2) = v;
            }
            auVar79 = (auVar29 | auVar153) ^ auVar18;
            auVar89._0_4_ = -(uint)(iVar13 < auVar79._0_4_);
            auVar89._4_4_ = -(uint)(iVar41 < auVar79._4_4_);
            auVar89._8_4_ = -(uint)(iVar184 < auVar79._8_4_);
            auVar89._12_4_ = -(uint)(iVar28 < auVar79._12_4_);
            auVar56._4_4_ = auVar89._0_4_;
            auVar56._0_4_ = auVar89._0_4_;
            auVar56._8_4_ = auVar89._8_4_;
            auVar56._12_4_ = auVar89._8_4_;
            auVar30._4_4_ = -(uint)(auVar79._4_4_ == iVar41);
            auVar30._12_4_ = -(uint)(auVar79._12_4_ == iVar28);
            auVar30._0_4_ = auVar30._4_4_;
            auVar30._8_4_ = auVar30._12_4_;
            auVar43._4_4_ = auVar89._4_4_;
            auVar43._0_4_ = auVar89._4_4_;
            auVar43._8_4_ = auVar89._12_4_;
            auVar43._12_4_ = auVar89._12_4_;
            auVar79 = packssdw(auVar89,auVar30 & auVar56 | auVar43);
            auVar79 = packssdw(auVar79 ^ in_XMM15,auVar79 ^ in_XMM15);
            if ((auVar79 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              *(unsigned_short *)(lVar8 + -2 + uVar11 * 2) = v;
            }
            auVar146 = pshufhw(auVar56,auVar56,0x84);
            auVar79 = pshufhw(auVar30,auVar30,0x84);
            auVar145 = pshufhw(auVar43,auVar43,0x84);
            in_XMM1 = packssdw(auVar79 & auVar146,(auVar145 | auVar79 & auVar146) ^ in_XMM15);
            if ((in_XMM1 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              *(unsigned_short *)(lVar8 + uVar11 * 2) = v;
            }
            uVar11 = uVar11 + 8;
          } while ((lVar14 + 7U & 0xfffffffffffffff8) != uVar11);
        }
        local_b0 = local_b0 + (int)uVar6;
        pvVar17 = (void *)((long)pvVar17 + lVar7 * 2);
        iVar178 = iVar178 + 1;
        lVar10 = lVar10 + lVar7 * 2;
      } while (iVar178 < src->h + top);
    }
    auVar18 = _DAT_0055f000;
    auVar176 = _DAT_0055eff0;
    auVar169 = _DAT_00553770;
    auVar155 = _DAT_00553760;
    auVar153 = _DAT_005530d0;
    in_XMM7 = auVar81;
    if (iVar178 < iVar3) {
      lVar10 = (ulong)uVar2 - 1;
      auVar21._8_4_ = (int)lVar10;
      auVar21._0_8_ = lVar10;
      auVar21._12_4_ = (int)((ulong)lVar10 >> 0x20);
      auVar21 = auVar21 ^ _DAT_005530d0;
      in_XMM6._8_4_ = 0xffffffff;
      in_XMM6._0_8_ = 0xffffffffffffffff;
      in_XMM6._12_4_ = 0xffffffff;
      do {
        if (0 < (int)uVar2) {
          lVar10 = 0;
          in_XMM8 = auVar169;
          auVar148 = auVar155;
          auVar152 = auVar176;
          auVar154 = _DAT_0055efe0;
          do {
            auVar81 = in_XMM8 ^ auVar153;
            iVar13 = auVar21._0_4_;
            iVar177 = -(uint)(iVar13 < auVar81._0_4_);
            iVar41 = auVar21._4_4_;
            auVar164._4_4_ = -(uint)(iVar41 < auVar81._4_4_);
            iVar184 = auVar21._8_4_;
            iVar183 = -(uint)(iVar184 < auVar81._8_4_);
            iVar28 = auVar21._12_4_;
            auVar164._12_4_ = -(uint)(iVar28 < auVar81._12_4_);
            auVar172._4_4_ = iVar177;
            auVar172._0_4_ = iVar177;
            auVar172._8_4_ = iVar183;
            auVar172._12_4_ = iVar183;
            auVar79 = pshuflw(in_XMM15,auVar172,0xe8);
            auVar163._4_4_ = -(uint)(auVar81._4_4_ == iVar41);
            auVar163._12_4_ = -(uint)(auVar81._12_4_ == iVar28);
            auVar163._0_4_ = auVar163._4_4_;
            auVar163._8_4_ = auVar163._12_4_;
            auVar81 = pshuflw(in_XMM1,auVar163,0xe8);
            auVar164._0_4_ = auVar164._4_4_;
            auVar164._8_4_ = auVar164._12_4_;
            auVar145 = pshuflw(auVar79,auVar164,0xe8);
            auVar81 = (auVar145 | auVar81 & auVar79) ^ in_XMM6;
            auVar81 = packssdw(auVar81,auVar81);
            if ((auVar81 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(unsigned_short *)((long)pvVar17 + lVar10) = v;
            }
            auVar164 = auVar163 & auVar172 | auVar164;
            auVar79 = packssdw(auVar164,auVar164);
            auVar79 = packssdw(auVar79 ^ in_XMM6,auVar79 ^ in_XMM6);
            if ((auVar79._0_4_ >> 0x10 & 1) != 0) {
              *(unsigned_short *)((long)pvVar17 + lVar10 + 2) = v;
            }
            auVar79 = auVar148 ^ auVar153;
            iVar177 = -(uint)(iVar13 < auVar79._0_4_);
            auVar181._4_4_ = -(uint)(iVar41 < auVar79._4_4_);
            iVar183 = -(uint)(iVar184 < auVar79._8_4_);
            auVar181._12_4_ = -(uint)(iVar28 < auVar79._12_4_);
            auVar165._4_4_ = iVar177;
            auVar165._0_4_ = iVar177;
            auVar165._8_4_ = iVar183;
            auVar165._12_4_ = iVar183;
            iVar177 = -(uint)(auVar79._4_4_ == iVar41);
            iVar183 = -(uint)(auVar79._12_4_ == iVar28);
            auVar173._4_4_ = iVar177;
            auVar173._0_4_ = iVar177;
            auVar173._8_4_ = iVar183;
            auVar173._12_4_ = iVar183;
            auVar181._0_4_ = auVar181._4_4_;
            auVar181._8_4_ = auVar181._12_4_;
            auVar79 = auVar173 & auVar165 | auVar181;
            auVar79 = packssdw(auVar79,auVar79);
            auVar79 = packssdw(auVar79 ^ in_XMM6,auVar79 ^ in_XMM6);
            if ((auVar79 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              *(unsigned_short *)((long)pvVar17 + lVar10 + 4) = v;
            }
            auVar79 = pshufhw(auVar79,auVar165,0x84);
            auVar146 = pshufhw(auVar165,auVar173,0x84);
            auVar145 = pshufhw(auVar79,auVar181,0x84);
            auVar79 = (auVar145 | auVar146 & auVar79) ^ in_XMM6;
            auVar79 = packssdw(auVar79,auVar79);
            if ((auVar79 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              *(unsigned_short *)((long)pvVar17 + lVar10 + 6) = v;
            }
            auVar79 = auVar152 ^ auVar153;
            iVar177 = -(uint)(iVar13 < auVar79._0_4_);
            auVar167._4_4_ = -(uint)(iVar41 < auVar79._4_4_);
            iVar183 = -(uint)(iVar184 < auVar79._8_4_);
            auVar167._12_4_ = -(uint)(iVar28 < auVar79._12_4_);
            auVar174._4_4_ = iVar177;
            auVar174._0_4_ = iVar177;
            auVar174._8_4_ = iVar183;
            auVar174._12_4_ = iVar183;
            auVar145 = pshuflw(auVar81,auVar174,0xe8);
            auVar31._0_4_ = -(uint)(auVar79._0_4_ == iVar13);
            auVar31._4_4_ = -(uint)(auVar79._4_4_ == iVar41);
            auVar31._8_4_ = -(uint)(auVar79._8_4_ == iVar184);
            auVar31._12_4_ = -(uint)(auVar79._12_4_ == iVar28);
            auVar166._4_4_ = auVar31._4_4_;
            auVar166._0_4_ = auVar31._4_4_;
            auVar166._8_4_ = auVar31._12_4_;
            auVar166._12_4_ = auVar31._12_4_;
            auVar81 = pshuflw(auVar31,auVar166,0xe8);
            auVar167._0_4_ = auVar167._4_4_;
            auVar167._8_4_ = auVar167._12_4_;
            auVar79 = pshuflw(auVar145,auVar167,0xe8);
            in_XMM15 = (auVar79 | auVar81 & auVar145) ^ in_XMM6;
            auVar81 = packssdw(auVar81 & auVar145,in_XMM15);
            if ((auVar81 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(unsigned_short *)((long)pvVar17 + lVar10 + 8) = v;
            }
            auVar167 = auVar166 & auVar174 | auVar167;
            auVar79 = packssdw(auVar167,auVar167);
            auVar81 = packssdw(auVar81,auVar79 ^ in_XMM6);
            if ((auVar81 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
              *(unsigned_short *)((long)pvVar17 + lVar10 + 10) = v;
            }
            auVar81 = auVar154 ^ auVar153;
            iVar13 = -(uint)(iVar13 < auVar81._0_4_);
            auVar182._4_4_ = -(uint)(iVar41 < auVar81._4_4_);
            iVar184 = -(uint)(iVar184 < auVar81._8_4_);
            auVar182._12_4_ = -(uint)(iVar28 < auVar81._12_4_);
            auVar168._4_4_ = iVar13;
            auVar168._0_4_ = iVar13;
            auVar168._8_4_ = iVar184;
            auVar168._12_4_ = iVar184;
            iVar13 = -(uint)(auVar81._4_4_ == iVar41);
            iVar41 = -(uint)(auVar81._12_4_ == iVar28);
            auVar175._4_4_ = iVar13;
            auVar175._0_4_ = iVar13;
            auVar175._8_4_ = iVar41;
            auVar175._12_4_ = iVar41;
            auVar182._0_4_ = auVar182._4_4_;
            auVar182._8_4_ = auVar182._12_4_;
            auVar81 = auVar175 & auVar168 | auVar182;
            auVar81 = packssdw(auVar81,auVar81);
            auVar81 = packssdw(auVar81 ^ in_XMM6,auVar81 ^ in_XMM6);
            if ((auVar81 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              *(unsigned_short *)((long)pvVar17 + lVar10 + 0xc) = v;
            }
            auVar81 = pshufhw(auVar81,auVar168,0x84);
            auVar145 = pshufhw(auVar168,auVar175,0x84);
            auVar79 = pshufhw(auVar81,auVar182,0x84);
            auVar81 = (auVar79 | auVar145 & auVar81) ^ in_XMM6;
            in_XMM1 = packssdw(auVar81,auVar81);
            if ((in_XMM1 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              *(unsigned_short *)((long)pvVar17 + lVar10 + 0xe) = v;
            }
            lVar8 = auVar18._0_8_;
            lVar15 = in_XMM8._8_8_;
            in_XMM8._0_8_ = in_XMM8._0_8_ + lVar8;
            lVar14 = auVar18._8_8_;
            in_XMM8._8_8_ = lVar15 + lVar14;
            lVar15 = auVar148._8_8_;
            auVar148._0_8_ = auVar148._0_8_ + lVar8;
            auVar148._8_8_ = lVar15 + lVar14;
            lVar15 = auVar152._8_8_;
            auVar152._0_8_ = auVar152._0_8_ + lVar8;
            auVar152._8_8_ = lVar15 + lVar14;
            lVar15 = auVar154._8_8_;
            auVar154._0_8_ = auVar154._0_8_ + lVar8;
            auVar154._8_8_ = lVar15 + lVar14;
            lVar10 = lVar10 + 0x10;
          } while ((ulong)(uVar2 + 7 >> 3) << 4 != lVar10);
        }
        pvVar17 = (void *)((long)pvVar17 + lVar7 * 2);
        iVar178 = iVar178 + 1;
        in_XMM7 = auVar18;
      } while (iVar178 != iVar3);
    }
  }
  puVar9 = local_b0;
  if (type == 1) {
    if (top < 1) {
      iVar178 = 0;
    }
    else {
      lVar10 = uVar16 - 1;
      auVar149._8_4_ = (int)lVar10;
      auVar149._0_8_ = lVar10;
      auVar149._12_4_ = (int)((ulong)lVar10 >> 0x20);
      lVar10 = (long)pvVar17 + 0xe;
      iVar13 = 0;
      auVar149 = auVar149 ^ _DAT_005530d0;
      auVar187._8_4_ = 0xffffffff;
      auVar187._0_8_ = 0xffffffffffffffff;
      auVar187._12_4_ = 0xffffffff;
      auVar153 = _DAT_0055efe0;
      auVar155 = _DAT_0055eff0;
      auVar169 = _DAT_00553760;
      auVar176 = _DAT_00553770;
      auVar81 = _DAT_005530d0;
      do {
        uVar11 = 0;
        if (0 < left) {
          uVar1 = *local_b0;
          lVar8 = 0;
          auVar22 = auVar176;
          auVar32 = auVar169;
          auVar44 = auVar155;
          auVar57 = auVar153;
          do {
            auVar18 = auVar22 ^ auVar81;
            iVar184 = auVar149._0_4_;
            iVar178 = -(uint)(iVar184 < auVar18._0_4_);
            iVar28 = auVar149._4_4_;
            auVar91._4_4_ = -(uint)(iVar28 < auVar18._4_4_);
            iVar177 = auVar149._8_4_;
            iVar41 = -(uint)(iVar177 < auVar18._8_4_);
            iVar183 = auVar149._12_4_;
            auVar91._12_4_ = -(uint)(iVar183 < auVar18._12_4_);
            auVar126._4_4_ = iVar178;
            auVar126._0_4_ = iVar178;
            auVar126._8_4_ = iVar41;
            auVar126._12_4_ = iVar41;
            auVar79 = pshuflw(in_XMM7,auVar126,0xe8);
            auVar90._4_4_ = -(uint)(auVar18._4_4_ == iVar28);
            auVar90._12_4_ = -(uint)(auVar18._12_4_ == iVar183);
            auVar90._0_4_ = auVar90._4_4_;
            auVar90._8_4_ = auVar90._12_4_;
            auVar145 = pshuflw(in_XMM8,auVar90,0xe8);
            auVar91._0_4_ = auVar91._4_4_;
            auVar91._8_4_ = auVar91._12_4_;
            auVar18 = pshuflw(auVar79,auVar91,0xe8);
            auVar18 = (auVar18 | auVar145 & auVar79) ^ auVar187;
            auVar18 = packssdw(auVar18,auVar18);
            if ((auVar18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(undefined2 *)((long)pvVar17 + lVar8) = uVar1;
            }
            auVar91 = auVar90 & auVar126 | auVar91;
            auVar18 = packssdw(auVar91,auVar91);
            auVar18 = packssdw(auVar18 ^ auVar187,auVar18 ^ auVar187);
            if ((auVar18._0_4_ >> 0x10 & 1) != 0) {
              *(undefined2 *)((long)pvVar17 + lVar8 + 2) = uVar1;
            }
            auVar18 = auVar32 ^ auVar81;
            iVar178 = -(uint)(iVar184 < auVar18._0_4_);
            auVar142._4_4_ = -(uint)(iVar28 < auVar18._4_4_);
            iVar41 = -(uint)(iVar177 < auVar18._8_4_);
            auVar142._12_4_ = -(uint)(iVar183 < auVar18._12_4_);
            auVar92._4_4_ = iVar178;
            auVar92._0_4_ = iVar178;
            auVar92._8_4_ = iVar41;
            auVar92._12_4_ = iVar41;
            auVar127._4_4_ = -(uint)(auVar18._4_4_ == iVar28);
            auVar127._12_4_ = -(uint)(auVar18._12_4_ == iVar183);
            auVar127._0_4_ = auVar127._4_4_;
            auVar127._8_4_ = auVar127._12_4_;
            auVar142._0_4_ = auVar142._4_4_;
            auVar142._8_4_ = auVar142._12_4_;
            auVar18 = auVar127 & auVar92 | auVar142;
            auVar18 = packssdw(auVar18,auVar18);
            auVar18 = packssdw(auVar18 ^ auVar187,auVar18 ^ auVar187);
            if ((auVar18 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              *(undefined2 *)((long)pvVar17 + lVar8 + 4) = uVar1;
            }
            auVar146 = pshufhw(auVar92,auVar92,0x84);
            auVar158 = pshufhw(auVar127,auVar127,0x84);
            auVar156 = pshufhw(auVar146,auVar142,0x84);
            auVar146 = (auVar156 | auVar158 & auVar146) ^ auVar187;
            auVar146 = packssdw(auVar146,auVar146);
            if ((auVar146 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              *(undefined2 *)((long)pvVar17 + lVar8 + 6) = uVar1;
            }
            auVar146 = auVar44 ^ auVar81;
            iVar178 = -(uint)(iVar184 < auVar146._0_4_);
            auVar94._4_4_ = -(uint)(iVar28 < auVar146._4_4_);
            iVar41 = -(uint)(iVar177 < auVar146._8_4_);
            auVar94._12_4_ = -(uint)(iVar183 < auVar146._12_4_);
            auVar128._4_4_ = iVar178;
            auVar128._0_4_ = iVar178;
            auVar128._8_4_ = iVar41;
            auVar128._12_4_ = iVar41;
            auVar18 = pshuflw(auVar18,auVar128,0xe8);
            auVar93._4_4_ = -(uint)(auVar146._4_4_ == iVar28);
            auVar93._12_4_ = -(uint)(auVar146._12_4_ == iVar183);
            auVar93._0_4_ = auVar93._4_4_;
            auVar93._8_4_ = auVar93._12_4_;
            auVar79 = pshuflw(auVar145 & auVar79,auVar93,0xe8);
            in_XMM8 = auVar79 & auVar18;
            auVar94._0_4_ = auVar94._4_4_;
            auVar94._8_4_ = auVar94._12_4_;
            auVar18 = pshuflw(auVar18,auVar94,0xe8);
            auVar18 = (auVar18 | in_XMM8) ^ auVar187;
            auVar18 = packssdw(auVar18,auVar18);
            if ((auVar18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(undefined2 *)((long)pvVar17 + lVar8 + 8) = uVar1;
            }
            auVar94 = auVar93 & auVar128 | auVar94;
            auVar18 = packssdw(auVar94,auVar94);
            auVar18 = packssdw(auVar18 ^ auVar187,auVar18 ^ auVar187);
            if ((auVar18 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
              *(undefined2 *)((long)pvVar17 + lVar8 + 10) = uVar1;
            }
            auVar18 = auVar57 ^ auVar81;
            iVar178 = -(uint)(iVar184 < auVar18._0_4_);
            in_XMM6._4_4_ = -(uint)(iVar28 < auVar18._4_4_);
            iVar41 = -(uint)(iVar177 < auVar18._8_4_);
            in_XMM6._12_4_ = -(uint)(iVar183 < auVar18._12_4_);
            auVar95._4_4_ = iVar178;
            auVar95._0_4_ = iVar178;
            auVar95._8_4_ = iVar41;
            auVar95._12_4_ = iVar41;
            auVar129._4_4_ = -(uint)(auVar18._4_4_ == iVar28);
            auVar129._12_4_ = -(uint)(auVar18._12_4_ == iVar183);
            auVar129._0_4_ = auVar129._4_4_;
            auVar129._8_4_ = auVar129._12_4_;
            in_XMM6._0_4_ = in_XMM6._4_4_;
            in_XMM6._8_4_ = in_XMM6._12_4_;
            auVar18 = auVar129 & auVar95 | in_XMM6;
            auVar18 = packssdw(auVar18,auVar18);
            in_XMM7 = packssdw(auVar18 ^ auVar187,auVar18 ^ auVar187);
            if ((in_XMM7 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              *(undefined2 *)((long)pvVar17 + lVar8 + 0xc) = uVar1;
            }
            auVar18 = pshufhw(auVar95,auVar95,0x84);
            auVar145 = pshufhw(auVar129,auVar129,0x84);
            auVar79 = pshufhw(auVar18,in_XMM6,0x84);
            auVar18 = (auVar79 | auVar145 & auVar18) ^ auVar187;
            auVar18 = packssdw(auVar18,auVar18);
            if ((auVar18 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              *(undefined2 *)((long)pvVar17 + lVar8 + 0xe) = uVar1;
            }
            lVar14 = auVar22._8_8_;
            lVar15 = (long)DAT_0055f000;
            auVar22._0_8_ = auVar22._0_8_ + lVar15;
            lVar78 = DAT_0055f000._8_8_;
            auVar22._8_8_ = lVar14 + lVar78;
            lVar14 = auVar32._8_8_;
            auVar32._0_8_ = auVar32._0_8_ + lVar15;
            auVar32._8_8_ = lVar14 + lVar78;
            lVar14 = auVar44._8_8_;
            auVar44._0_8_ = auVar44._0_8_ + lVar15;
            auVar44._8_8_ = lVar14 + lVar78;
            lVar14 = auVar57._8_8_;
            auVar57._0_8_ = auVar57._0_8_ + lVar15;
            auVar57._8_8_ = lVar14 + lVar78;
            lVar8 = lVar8 + 0x10;
            uVar11 = uVar16;
          } while ((ulong)(left + 7U >> 3) << 4 != lVar8);
        }
        uVar6 = src->w;
        if ((int)uVar6 < 0xc) {
          uVar5 = uVar6 + left;
          if ((int)uVar11 < (int)uVar5) {
            do {
              *(undefined2 *)((long)pvVar17 + uVar11 * 2) = local_b0[uVar11 - (long)left];
              uVar11 = uVar11 + 1;
            } while (uVar5 != uVar11);
            uVar11 = (ulong)uVar5;
          }
        }
        else {
          memcpy((void *)((long)pvVar17 + (long)left * 2),local_b0,(ulong)uVar6 * 2);
          auVar187._8_4_ = 0xffffffff;
          auVar187._0_8_ = 0xffffffffffffffff;
          auVar187._12_4_ = 0xffffffff;
          uVar6 = src->w;
          uVar11 = (ulong)((int)uVar11 + uVar6);
          auVar153 = _DAT_0055efe0;
          auVar155 = _DAT_0055eff0;
          auVar169 = _DAT_00553760;
          auVar176 = _DAT_00553770;
          auVar81 = _DAT_005530d0;
        }
        iVar178 = (int)uVar11;
        if (iVar178 < (int)uVar2) {
          uVar1 = local_b0[(long)(int)uVar6 + -1];
          lVar14 = lVar7 - iVar178;
          lVar8 = lVar14 + -1;
          auVar23._8_4_ = (int)lVar8;
          auVar23._0_8_ = lVar8;
          auVar23._12_4_ = (int)((ulong)lVar8 >> 0x20);
          lVar8 = (long)iVar178 * 2 + lVar10;
          uVar11 = 0;
          do {
            auVar33._8_4_ = (int)uVar11;
            auVar33._0_8_ = uVar11;
            auVar33._12_4_ = (int)(uVar11 >> 0x20);
            auVar18 = auVar23 ^ auVar81;
            auVar79 = (auVar33 | auVar176) ^ auVar81;
            iVar178 = auVar18._0_4_;
            iVar177 = -(uint)(iVar178 < auVar79._0_4_);
            iVar41 = auVar18._4_4_;
            auVar59._4_4_ = -(uint)(iVar41 < auVar79._4_4_);
            iVar184 = auVar18._8_4_;
            iVar183 = -(uint)(iVar184 < auVar79._8_4_);
            iVar28 = auVar18._12_4_;
            auVar59._12_4_ = -(uint)(iVar28 < auVar79._12_4_);
            auVar96._4_4_ = iVar177;
            auVar96._0_4_ = iVar177;
            auVar96._8_4_ = iVar183;
            auVar96._12_4_ = iVar183;
            auVar18 = pshuflw(in_XMM6,auVar96,0xe8);
            auVar58._4_4_ = -(uint)(auVar79._4_4_ == iVar41);
            auVar58._12_4_ = -(uint)(auVar79._12_4_ == iVar28);
            auVar58._0_4_ = auVar58._4_4_;
            auVar58._8_4_ = auVar58._12_4_;
            auVar145 = pshuflw(in_XMM7,auVar58,0xe8);
            auVar59._0_4_ = auVar59._4_4_;
            auVar59._8_4_ = auVar59._12_4_;
            auVar79 = pshuflw(auVar18,auVar59,0xe8);
            auVar79 = (auVar79 | auVar145 & auVar18) ^ auVar187;
            auVar79 = packssdw(auVar79,auVar79);
            if ((auVar79 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(undefined2 *)(lVar8 + -0xe + uVar11 * 2) = uVar1;
            }
            auVar59 = auVar58 & auVar96 | auVar59;
            auVar79 = packssdw(auVar59,auVar59);
            auVar79 = packssdw(auVar79 ^ auVar187,auVar79 ^ auVar187);
            if ((auVar79._0_4_ >> 0x10 & 1) != 0) {
              *(undefined2 *)(lVar8 + -0xc + uVar11 * 2) = uVar1;
            }
            auVar79 = (auVar33 | auVar169) ^ auVar81;
            iVar177 = -(uint)(iVar178 < auVar79._0_4_);
            auVar130._4_4_ = -(uint)(iVar41 < auVar79._4_4_);
            iVar183 = -(uint)(iVar184 < auVar79._8_4_);
            auVar130._12_4_ = -(uint)(iVar28 < auVar79._12_4_);
            auVar60._4_4_ = iVar177;
            auVar60._0_4_ = iVar177;
            auVar60._8_4_ = iVar183;
            auVar60._12_4_ = iVar183;
            auVar97._4_4_ = -(uint)(auVar79._4_4_ == iVar41);
            auVar97._12_4_ = -(uint)(auVar79._12_4_ == iVar28);
            auVar97._0_4_ = auVar97._4_4_;
            auVar97._8_4_ = auVar97._12_4_;
            auVar130._0_4_ = auVar130._4_4_;
            auVar130._8_4_ = auVar130._12_4_;
            auVar79 = auVar97 & auVar60 | auVar130;
            auVar79 = packssdw(auVar79,auVar79);
            auVar79 = packssdw(auVar79 ^ auVar187,auVar79 ^ auVar187);
            if ((auVar79 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              *(undefined2 *)(lVar8 + -10 + uVar11 * 2) = uVar1;
            }
            auVar146 = pshufhw(auVar60,auVar60,0x84);
            auVar158 = pshufhw(auVar97,auVar97,0x84);
            auVar156 = pshufhw(auVar146,auVar130,0x84);
            auVar146 = (auVar156 | auVar158 & auVar146) ^ auVar187;
            auVar146 = packssdw(auVar146,auVar146);
            if ((auVar146 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              *(undefined2 *)(lVar8 + -8 + uVar11 * 2) = uVar1;
            }
            auVar146 = (auVar33 | auVar155) ^ auVar81;
            iVar177 = -(uint)(iVar178 < auVar146._0_4_);
            auVar62._4_4_ = -(uint)(iVar41 < auVar146._4_4_);
            iVar183 = -(uint)(iVar184 < auVar146._8_4_);
            auVar62._12_4_ = -(uint)(iVar28 < auVar146._12_4_);
            auVar98._4_4_ = iVar177;
            auVar98._0_4_ = iVar177;
            auVar98._8_4_ = iVar183;
            auVar98._12_4_ = iVar183;
            auVar79 = pshuflw(auVar79,auVar98,0xe8);
            auVar61._4_4_ = -(uint)(auVar146._4_4_ == iVar41);
            auVar61._12_4_ = -(uint)(auVar146._12_4_ == iVar28);
            auVar61._0_4_ = auVar61._4_4_;
            auVar61._8_4_ = auVar61._12_4_;
            auVar18 = pshuflw(auVar145 & auVar18,auVar61,0xe8);
            in_XMM7 = auVar18 & auVar79;
            auVar62._0_4_ = auVar62._4_4_;
            auVar62._8_4_ = auVar62._12_4_;
            auVar18 = pshuflw(auVar79,auVar62,0xe8);
            auVar18 = (auVar18 | in_XMM7) ^ auVar187;
            in_XMM6 = packssdw(auVar18,auVar18);
            if ((in_XMM6 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(undefined2 *)(lVar8 + -6 + uVar11 * 2) = uVar1;
            }
            auVar62 = auVar61 & auVar98 | auVar62;
            auVar18 = packssdw(auVar62,auVar62);
            auVar18 = packssdw(auVar18 ^ auVar187,auVar18 ^ auVar187);
            if ((auVar18 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
              *(undefined2 *)(lVar8 + -4 + uVar11 * 2) = uVar1;
            }
            auVar18 = (auVar33 | auVar153) ^ auVar81;
            auVar99._0_4_ = -(uint)(iVar178 < auVar18._0_4_);
            auVar99._4_4_ = -(uint)(iVar41 < auVar18._4_4_);
            auVar99._8_4_ = -(uint)(iVar184 < auVar18._8_4_);
            auVar99._12_4_ = -(uint)(iVar28 < auVar18._12_4_);
            auVar63._4_4_ = auVar99._0_4_;
            auVar63._0_4_ = auVar99._0_4_;
            auVar63._8_4_ = auVar99._8_4_;
            auVar63._12_4_ = auVar99._8_4_;
            auVar34._4_4_ = -(uint)(auVar18._4_4_ == iVar41);
            auVar34._12_4_ = -(uint)(auVar18._12_4_ == iVar28);
            auVar34._0_4_ = auVar34._4_4_;
            auVar34._8_4_ = auVar34._12_4_;
            auVar45._4_4_ = auVar99._4_4_;
            auVar45._0_4_ = auVar99._4_4_;
            auVar45._8_4_ = auVar99._12_4_;
            auVar45._12_4_ = auVar99._12_4_;
            auVar18 = packssdw(auVar99,auVar34 & auVar63 | auVar45);
            auVar18 = packssdw(auVar18 ^ auVar187,auVar18 ^ auVar187);
            if ((auVar18 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              *(undefined2 *)(lVar8 + -2 + uVar11 * 2) = uVar1;
            }
            auVar145 = pshufhw(auVar63,auVar63,0x84);
            auVar18 = pshufhw(auVar34,auVar34,0x84);
            auVar79 = pshufhw(auVar45,auVar45,0x84);
            auVar18 = packssdw(auVar18 & auVar145,(auVar79 | auVar18 & auVar145) ^ auVar187);
            if ((auVar18 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              *(undefined2 *)(lVar8 + uVar11 * 2) = uVar1;
            }
            uVar11 = uVar11 + 8;
          } while ((lVar14 + 7U & 0xfffffffffffffff8) != uVar11);
        }
        pvVar17 = (void *)((long)pvVar17 + lVar7 * 2);
        iVar13 = iVar13 + 1;
        lVar10 = lVar10 + lVar7 * 2;
        iVar178 = top;
      } while (iVar13 != top);
    }
    if (iVar178 < src->h + top) {
      lVar10 = uVar16 - 1;
      auVar150._8_4_ = (int)lVar10;
      auVar150._0_8_ = lVar10;
      auVar150._12_4_ = (int)((ulong)lVar10 >> 0x20);
      lVar8 = (long)pvVar17 + 0xe;
      auVar150 = auVar150 ^ _DAT_005530d0;
      auVar188._8_4_ = 0xffffffff;
      auVar188._0_8_ = 0xffffffffffffffff;
      auVar188._12_4_ = 0xffffffff;
      auVar153 = _DAT_0055efe0;
      auVar155 = _DAT_0055eff0;
      auVar169 = _DAT_00553760;
      auVar176 = _DAT_00553770;
      auVar81 = _DAT_005530d0;
      do {
        uVar12 = 0;
        if (0 < left) {
          uVar1 = *local_b0;
          lVar10 = 0;
          auVar24 = auVar176;
          auVar35 = auVar169;
          auVar46 = auVar155;
          auVar64 = auVar153;
          do {
            auVar18 = auVar24 ^ auVar81;
            iVar184 = auVar150._0_4_;
            iVar13 = -(uint)(iVar184 < auVar18._0_4_);
            iVar28 = auVar150._4_4_;
            auVar101._4_4_ = -(uint)(iVar28 < auVar18._4_4_);
            iVar177 = auVar150._8_4_;
            iVar41 = -(uint)(iVar177 < auVar18._8_4_);
            iVar183 = auVar150._12_4_;
            auVar101._12_4_ = -(uint)(iVar183 < auVar18._12_4_);
            auVar131._4_4_ = iVar13;
            auVar131._0_4_ = iVar13;
            auVar131._8_4_ = iVar41;
            auVar131._12_4_ = iVar41;
            auVar79 = pshuflw(in_XMM7,auVar131,0xe8);
            auVar100._4_4_ = -(uint)(auVar18._4_4_ == iVar28);
            auVar100._12_4_ = -(uint)(auVar18._12_4_ == iVar183);
            auVar100._0_4_ = auVar100._4_4_;
            auVar100._8_4_ = auVar100._12_4_;
            auVar145 = pshuflw(in_XMM8,auVar100,0xe8);
            auVar101._0_4_ = auVar101._4_4_;
            auVar101._8_4_ = auVar101._12_4_;
            auVar18 = pshuflw(auVar79,auVar101,0xe8);
            auVar18 = (auVar18 | auVar145 & auVar79) ^ auVar188;
            auVar18 = packssdw(auVar18,auVar18);
            if ((auVar18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(undefined2 *)((long)pvVar17 + lVar10) = uVar1;
            }
            auVar101 = auVar100 & auVar131 | auVar101;
            auVar18 = packssdw(auVar101,auVar101);
            auVar18 = packssdw(auVar18 ^ auVar188,auVar18 ^ auVar188);
            if ((auVar18._0_4_ >> 0x10 & 1) != 0) {
              *(undefined2 *)((long)pvVar17 + lVar10 + 2) = uVar1;
            }
            auVar18 = auVar35 ^ auVar81;
            iVar13 = -(uint)(iVar184 < auVar18._0_4_);
            auVar143._4_4_ = -(uint)(iVar28 < auVar18._4_4_);
            iVar41 = -(uint)(iVar177 < auVar18._8_4_);
            auVar143._12_4_ = -(uint)(iVar183 < auVar18._12_4_);
            auVar102._4_4_ = iVar13;
            auVar102._0_4_ = iVar13;
            auVar102._8_4_ = iVar41;
            auVar102._12_4_ = iVar41;
            auVar132._4_4_ = -(uint)(auVar18._4_4_ == iVar28);
            auVar132._12_4_ = -(uint)(auVar18._12_4_ == iVar183);
            auVar132._0_4_ = auVar132._4_4_;
            auVar132._8_4_ = auVar132._12_4_;
            auVar143._0_4_ = auVar143._4_4_;
            auVar143._8_4_ = auVar143._12_4_;
            auVar18 = auVar132 & auVar102 | auVar143;
            auVar18 = packssdw(auVar18,auVar18);
            auVar18 = packssdw(auVar18 ^ auVar188,auVar18 ^ auVar188);
            if ((auVar18 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              *(undefined2 *)((long)pvVar17 + lVar10 + 4) = uVar1;
            }
            auVar146 = pshufhw(auVar102,auVar102,0x84);
            auVar158 = pshufhw(auVar132,auVar132,0x84);
            auVar156 = pshufhw(auVar146,auVar143,0x84);
            auVar146 = (auVar156 | auVar158 & auVar146) ^ auVar188;
            auVar146 = packssdw(auVar146,auVar146);
            if ((auVar146 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              *(undefined2 *)((long)pvVar17 + lVar10 + 6) = uVar1;
            }
            auVar146 = auVar46 ^ auVar81;
            iVar13 = -(uint)(iVar184 < auVar146._0_4_);
            auVar104._4_4_ = -(uint)(iVar28 < auVar146._4_4_);
            iVar41 = -(uint)(iVar177 < auVar146._8_4_);
            auVar104._12_4_ = -(uint)(iVar183 < auVar146._12_4_);
            auVar133._4_4_ = iVar13;
            auVar133._0_4_ = iVar13;
            auVar133._8_4_ = iVar41;
            auVar133._12_4_ = iVar41;
            auVar18 = pshuflw(auVar18,auVar133,0xe8);
            auVar103._4_4_ = -(uint)(auVar146._4_4_ == iVar28);
            auVar103._12_4_ = -(uint)(auVar146._12_4_ == iVar183);
            auVar103._0_4_ = auVar103._4_4_;
            auVar103._8_4_ = auVar103._12_4_;
            auVar79 = pshuflw(auVar145 & auVar79,auVar103,0xe8);
            in_XMM8 = auVar79 & auVar18;
            auVar104._0_4_ = auVar104._4_4_;
            auVar104._8_4_ = auVar104._12_4_;
            auVar18 = pshuflw(auVar18,auVar104,0xe8);
            auVar18 = (auVar18 | in_XMM8) ^ auVar188;
            auVar18 = packssdw(auVar18,auVar18);
            if ((auVar18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(undefined2 *)((long)pvVar17 + lVar10 + 8) = uVar1;
            }
            auVar104 = auVar103 & auVar133 | auVar104;
            auVar18 = packssdw(auVar104,auVar104);
            auVar18 = packssdw(auVar18 ^ auVar188,auVar18 ^ auVar188);
            if ((auVar18 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
              *(undefined2 *)((long)pvVar17 + lVar10 + 10) = uVar1;
            }
            auVar18 = auVar64 ^ auVar81;
            iVar13 = -(uint)(iVar184 < auVar18._0_4_);
            in_XMM6._4_4_ = -(uint)(iVar28 < auVar18._4_4_);
            iVar41 = -(uint)(iVar177 < auVar18._8_4_);
            in_XMM6._12_4_ = -(uint)(iVar183 < auVar18._12_4_);
            auVar105._4_4_ = iVar13;
            auVar105._0_4_ = iVar13;
            auVar105._8_4_ = iVar41;
            auVar105._12_4_ = iVar41;
            auVar134._4_4_ = -(uint)(auVar18._4_4_ == iVar28);
            auVar134._12_4_ = -(uint)(auVar18._12_4_ == iVar183);
            auVar134._0_4_ = auVar134._4_4_;
            auVar134._8_4_ = auVar134._12_4_;
            in_XMM6._0_4_ = in_XMM6._4_4_;
            in_XMM6._8_4_ = in_XMM6._12_4_;
            auVar18 = auVar134 & auVar105 | in_XMM6;
            auVar18 = packssdw(auVar18,auVar18);
            in_XMM7 = packssdw(auVar18 ^ auVar188,auVar18 ^ auVar188);
            if ((in_XMM7 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              *(undefined2 *)((long)pvVar17 + lVar10 + 0xc) = uVar1;
            }
            auVar18 = pshufhw(auVar105,auVar105,0x84);
            auVar145 = pshufhw(auVar134,auVar134,0x84);
            auVar79 = pshufhw(auVar18,in_XMM6,0x84);
            auVar18 = (auVar79 | auVar145 & auVar18) ^ auVar188;
            auVar18 = packssdw(auVar18,auVar18);
            if ((auVar18 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              *(undefined2 *)((long)pvVar17 + lVar10 + 0xe) = uVar1;
            }
            lVar14 = auVar24._8_8_;
            lVar15 = (long)DAT_0055f000;
            auVar24._0_8_ = auVar24._0_8_ + lVar15;
            lVar78 = DAT_0055f000._8_8_;
            auVar24._8_8_ = lVar14 + lVar78;
            lVar14 = auVar35._8_8_;
            auVar35._0_8_ = auVar35._0_8_ + lVar15;
            auVar35._8_8_ = lVar14 + lVar78;
            lVar14 = auVar46._8_8_;
            auVar46._0_8_ = auVar46._0_8_ + lVar15;
            auVar46._8_8_ = lVar14 + lVar78;
            lVar14 = auVar64._8_8_;
            auVar64._0_8_ = auVar64._0_8_ + lVar15;
            auVar64._8_8_ = lVar14 + lVar78;
            lVar10 = lVar10 + 0x10;
            uVar12 = uVar16;
          } while ((ulong)(left + 7U >> 3) << 4 != lVar10);
        }
        uVar6 = src->w;
        uVar11 = (ulong)uVar6;
        uVar5 = (uint)uVar12;
        if ((int)uVar6 < 0xc) {
          uVar6 = uVar6 + left;
          if ((int)uVar5 < (int)uVar6) {
            do {
              *(undefined2 *)((long)pvVar17 + uVar12 * 2) = local_b0[uVar12 - (long)left];
              uVar12 = uVar12 + 1;
              uVar5 = uVar6;
            } while (uVar6 != uVar12);
          }
        }
        else {
          memcpy((void *)((long)pvVar17 + (long)left * 2),local_b0,uVar11 * 2);
          auVar188._8_4_ = 0xffffffff;
          auVar188._0_8_ = 0xffffffffffffffff;
          auVar188._12_4_ = 0xffffffff;
          uVar11 = (ulong)(uint)src->w;
          auVar153 = _DAT_0055efe0;
          auVar155 = _DAT_0055eff0;
          auVar169 = _DAT_00553760;
          auVar176 = _DAT_00553770;
          auVar81 = _DAT_005530d0;
          uVar5 = uVar5 + src->w;
        }
        if ((int)uVar5 < (int)uVar2) {
          uVar1 = local_b0[(long)(int)uVar11 + -1];
          lVar14 = lVar7 - (int)uVar5;
          lVar10 = lVar14 + -1;
          auVar25._8_4_ = (int)lVar10;
          auVar25._0_8_ = lVar10;
          auVar25._12_4_ = (int)((ulong)lVar10 >> 0x20);
          lVar10 = (long)(int)uVar5 * 2 + lVar8;
          uVar12 = 0;
          do {
            auVar36._8_4_ = (int)uVar12;
            auVar36._0_8_ = uVar12;
            auVar36._12_4_ = (int)(uVar12 >> 0x20);
            auVar18 = auVar25 ^ auVar81;
            auVar79 = (auVar36 | auVar176) ^ auVar81;
            iVar13 = auVar18._0_4_;
            iVar177 = -(uint)(iVar13 < auVar79._0_4_);
            iVar41 = auVar18._4_4_;
            auVar66._4_4_ = -(uint)(iVar41 < auVar79._4_4_);
            iVar184 = auVar18._8_4_;
            iVar183 = -(uint)(iVar184 < auVar79._8_4_);
            iVar28 = auVar18._12_4_;
            auVar66._12_4_ = -(uint)(iVar28 < auVar79._12_4_);
            auVar106._4_4_ = iVar177;
            auVar106._0_4_ = iVar177;
            auVar106._8_4_ = iVar183;
            auVar106._12_4_ = iVar183;
            auVar18 = pshuflw(in_XMM6,auVar106,0xe8);
            auVar65._4_4_ = -(uint)(auVar79._4_4_ == iVar41);
            auVar65._12_4_ = -(uint)(auVar79._12_4_ == iVar28);
            auVar65._0_4_ = auVar65._4_4_;
            auVar65._8_4_ = auVar65._12_4_;
            auVar145 = pshuflw(in_XMM7,auVar65,0xe8);
            auVar66._0_4_ = auVar66._4_4_;
            auVar66._8_4_ = auVar66._12_4_;
            auVar79 = pshuflw(auVar18,auVar66,0xe8);
            auVar79 = (auVar79 | auVar145 & auVar18) ^ auVar188;
            auVar79 = packssdw(auVar79,auVar79);
            if ((auVar79 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(undefined2 *)(lVar10 + -0xe + uVar12 * 2) = uVar1;
            }
            auVar66 = auVar65 & auVar106 | auVar66;
            auVar79 = packssdw(auVar66,auVar66);
            auVar79 = packssdw(auVar79 ^ auVar188,auVar79 ^ auVar188);
            if ((auVar79._0_4_ >> 0x10 & 1) != 0) {
              *(undefined2 *)(lVar10 + -0xc + uVar12 * 2) = uVar1;
            }
            auVar79 = (auVar36 | auVar169) ^ auVar81;
            iVar177 = -(uint)(iVar13 < auVar79._0_4_);
            auVar135._4_4_ = -(uint)(iVar41 < auVar79._4_4_);
            iVar183 = -(uint)(iVar184 < auVar79._8_4_);
            auVar135._12_4_ = -(uint)(iVar28 < auVar79._12_4_);
            auVar67._4_4_ = iVar177;
            auVar67._0_4_ = iVar177;
            auVar67._8_4_ = iVar183;
            auVar67._12_4_ = iVar183;
            auVar107._4_4_ = -(uint)(auVar79._4_4_ == iVar41);
            auVar107._12_4_ = -(uint)(auVar79._12_4_ == iVar28);
            auVar107._0_4_ = auVar107._4_4_;
            auVar107._8_4_ = auVar107._12_4_;
            auVar135._0_4_ = auVar135._4_4_;
            auVar135._8_4_ = auVar135._12_4_;
            auVar79 = auVar107 & auVar67 | auVar135;
            auVar79 = packssdw(auVar79,auVar79);
            auVar79 = packssdw(auVar79 ^ auVar188,auVar79 ^ auVar188);
            if ((auVar79 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              *(undefined2 *)(lVar10 + -10 + uVar12 * 2) = uVar1;
            }
            auVar146 = pshufhw(auVar67,auVar67,0x84);
            auVar158 = pshufhw(auVar107,auVar107,0x84);
            auVar156 = pshufhw(auVar146,auVar135,0x84);
            auVar146 = (auVar156 | auVar158 & auVar146) ^ auVar188;
            auVar146 = packssdw(auVar146,auVar146);
            if ((auVar146 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              *(undefined2 *)(lVar10 + -8 + uVar12 * 2) = uVar1;
            }
            auVar146 = (auVar36 | auVar155) ^ auVar81;
            iVar177 = -(uint)(iVar13 < auVar146._0_4_);
            auVar69._4_4_ = -(uint)(iVar41 < auVar146._4_4_);
            iVar183 = -(uint)(iVar184 < auVar146._8_4_);
            auVar69._12_4_ = -(uint)(iVar28 < auVar146._12_4_);
            auVar108._4_4_ = iVar177;
            auVar108._0_4_ = iVar177;
            auVar108._8_4_ = iVar183;
            auVar108._12_4_ = iVar183;
            auVar79 = pshuflw(auVar79,auVar108,0xe8);
            auVar68._4_4_ = -(uint)(auVar146._4_4_ == iVar41);
            auVar68._12_4_ = -(uint)(auVar146._12_4_ == iVar28);
            auVar68._0_4_ = auVar68._4_4_;
            auVar68._8_4_ = auVar68._12_4_;
            auVar18 = pshuflw(auVar145 & auVar18,auVar68,0xe8);
            in_XMM7 = auVar18 & auVar79;
            auVar69._0_4_ = auVar69._4_4_;
            auVar69._8_4_ = auVar69._12_4_;
            auVar18 = pshuflw(auVar79,auVar69,0xe8);
            auVar18 = (auVar18 | in_XMM7) ^ auVar188;
            in_XMM6 = packssdw(auVar18,auVar18);
            if ((in_XMM6 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(undefined2 *)(lVar10 + -6 + uVar12 * 2) = uVar1;
            }
            auVar69 = auVar68 & auVar108 | auVar69;
            auVar18 = packssdw(auVar69,auVar69);
            auVar18 = packssdw(auVar18 ^ auVar188,auVar18 ^ auVar188);
            if ((auVar18 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
              *(undefined2 *)(lVar10 + -4 + uVar12 * 2) = uVar1;
            }
            auVar18 = (auVar36 | auVar153) ^ auVar81;
            auVar109._0_4_ = -(uint)(iVar13 < auVar18._0_4_);
            auVar109._4_4_ = -(uint)(iVar41 < auVar18._4_4_);
            auVar109._8_4_ = -(uint)(iVar184 < auVar18._8_4_);
            auVar109._12_4_ = -(uint)(iVar28 < auVar18._12_4_);
            auVar70._4_4_ = auVar109._0_4_;
            auVar70._0_4_ = auVar109._0_4_;
            auVar70._8_4_ = auVar109._8_4_;
            auVar70._12_4_ = auVar109._8_4_;
            auVar37._4_4_ = -(uint)(auVar18._4_4_ == iVar41);
            auVar37._12_4_ = -(uint)(auVar18._12_4_ == iVar28);
            auVar37._0_4_ = auVar37._4_4_;
            auVar37._8_4_ = auVar37._12_4_;
            auVar47._4_4_ = auVar109._4_4_;
            auVar47._0_4_ = auVar109._4_4_;
            auVar47._8_4_ = auVar109._12_4_;
            auVar47._12_4_ = auVar109._12_4_;
            auVar18 = packssdw(auVar109,auVar37 & auVar70 | auVar47);
            auVar18 = packssdw(auVar18 ^ auVar188,auVar18 ^ auVar188);
            if ((auVar18 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              *(undefined2 *)(lVar10 + -2 + uVar12 * 2) = uVar1;
            }
            auVar145 = pshufhw(auVar70,auVar70,0x84);
            auVar18 = pshufhw(auVar37,auVar37,0x84);
            auVar79 = pshufhw(auVar47,auVar47,0x84);
            auVar18 = packssdw(auVar18 & auVar145,(auVar79 | auVar18 & auVar145) ^ auVar188);
            if ((auVar18 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              *(undefined2 *)(lVar10 + uVar12 * 2) = uVar1;
            }
            uVar12 = uVar12 + 8;
          } while ((lVar14 + 7U & 0xfffffffffffffff8) != uVar12);
        }
        lVar10 = (long)(int)uVar11;
        local_b0 = local_b0 + lVar10;
        pvVar17 = (void *)((long)pvVar17 + lVar7 * 2);
        iVar178 = iVar178 + 1;
        lVar8 = lVar8 + lVar7 * 2;
      } while (iVar178 < src->h + top);
    }
    else {
      uVar11 = (ulong)(uint)src->w;
      lVar10 = (long)src->w;
    }
    puVar9 = local_b0 + -lVar10;
    if (iVar178 < iVar3) {
      lVar8 = uVar16 - 1;
      auVar151._8_4_ = (int)lVar8;
      auVar151._0_8_ = lVar8;
      auVar151._12_4_ = (int)((ulong)lVar8 >> 0x20);
      lVar8 = (long)pvVar17 + 0xe;
      auVar151 = auVar151 ^ _DAT_005530d0;
      auVar189._8_4_ = 0xffffffff;
      auVar189._0_8_ = 0xffffffffffffffff;
      auVar189._12_4_ = 0xffffffff;
      auVar153 = _DAT_0055efe0;
      auVar155 = _DAT_0055eff0;
      auVar169 = _DAT_00553760;
      auVar176 = _DAT_00553770;
      auVar81 = _DAT_005530d0;
      do {
        uVar12 = 0;
        if (0 < left) {
          uVar1 = *puVar9;
          lVar14 = 0;
          auVar26 = auVar176;
          auVar38 = auVar169;
          auVar48 = auVar155;
          auVar71 = auVar153;
          do {
            auVar18 = auVar26 ^ auVar81;
            iVar184 = auVar151._0_4_;
            iVar13 = -(uint)(iVar184 < auVar18._0_4_);
            iVar28 = auVar151._4_4_;
            auVar111._4_4_ = -(uint)(iVar28 < auVar18._4_4_);
            iVar177 = auVar151._8_4_;
            iVar41 = -(uint)(iVar177 < auVar18._8_4_);
            iVar183 = auVar151._12_4_;
            auVar111._12_4_ = -(uint)(iVar183 < auVar18._12_4_);
            auVar136._4_4_ = iVar13;
            auVar136._0_4_ = iVar13;
            auVar136._8_4_ = iVar41;
            auVar136._12_4_ = iVar41;
            auVar79 = pshuflw(in_XMM7,auVar136,0xe8);
            auVar110._4_4_ = -(uint)(auVar18._4_4_ == iVar28);
            auVar110._12_4_ = -(uint)(auVar18._12_4_ == iVar183);
            auVar110._0_4_ = auVar110._4_4_;
            auVar110._8_4_ = auVar110._12_4_;
            auVar145 = pshuflw(in_XMM8,auVar110,0xe8);
            auVar111._0_4_ = auVar111._4_4_;
            auVar111._8_4_ = auVar111._12_4_;
            auVar18 = pshuflw(auVar79,auVar111,0xe8);
            auVar18 = (auVar18 | auVar145 & auVar79) ^ auVar189;
            auVar18 = packssdw(auVar18,auVar18);
            if ((auVar18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(undefined2 *)((long)pvVar17 + lVar14) = uVar1;
            }
            auVar111 = auVar110 & auVar136 | auVar111;
            auVar18 = packssdw(auVar111,auVar111);
            auVar18 = packssdw(auVar18 ^ auVar189,auVar18 ^ auVar189);
            if ((auVar18._0_4_ >> 0x10 & 1) != 0) {
              *(undefined2 *)((long)pvVar17 + lVar14 + 2) = uVar1;
            }
            auVar18 = auVar38 ^ auVar81;
            iVar13 = -(uint)(iVar184 < auVar18._0_4_);
            auVar144._4_4_ = -(uint)(iVar28 < auVar18._4_4_);
            iVar41 = -(uint)(iVar177 < auVar18._8_4_);
            auVar144._12_4_ = -(uint)(iVar183 < auVar18._12_4_);
            auVar112._4_4_ = iVar13;
            auVar112._0_4_ = iVar13;
            auVar112._8_4_ = iVar41;
            auVar112._12_4_ = iVar41;
            auVar137._4_4_ = -(uint)(auVar18._4_4_ == iVar28);
            auVar137._12_4_ = -(uint)(auVar18._12_4_ == iVar183);
            auVar137._0_4_ = auVar137._4_4_;
            auVar137._8_4_ = auVar137._12_4_;
            auVar144._0_4_ = auVar144._4_4_;
            auVar144._8_4_ = auVar144._12_4_;
            auVar18 = auVar137 & auVar112 | auVar144;
            auVar18 = packssdw(auVar18,auVar18);
            auVar18 = packssdw(auVar18 ^ auVar189,auVar18 ^ auVar189);
            if ((auVar18 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              *(undefined2 *)((long)pvVar17 + lVar14 + 4) = uVar1;
            }
            auVar146 = pshufhw(auVar112,auVar112,0x84);
            auVar158 = pshufhw(auVar137,auVar137,0x84);
            auVar156 = pshufhw(auVar146,auVar144,0x84);
            auVar146 = (auVar156 | auVar158 & auVar146) ^ auVar189;
            auVar146 = packssdw(auVar146,auVar146);
            if ((auVar146 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              *(undefined2 *)((long)pvVar17 + lVar14 + 6) = uVar1;
            }
            auVar146 = auVar48 ^ auVar81;
            iVar13 = -(uint)(iVar184 < auVar146._0_4_);
            auVar114._4_4_ = -(uint)(iVar28 < auVar146._4_4_);
            iVar41 = -(uint)(iVar177 < auVar146._8_4_);
            auVar114._12_4_ = -(uint)(iVar183 < auVar146._12_4_);
            auVar138._4_4_ = iVar13;
            auVar138._0_4_ = iVar13;
            auVar138._8_4_ = iVar41;
            auVar138._12_4_ = iVar41;
            auVar18 = pshuflw(auVar18,auVar138,0xe8);
            auVar113._4_4_ = -(uint)(auVar146._4_4_ == iVar28);
            auVar113._12_4_ = -(uint)(auVar146._12_4_ == iVar183);
            auVar113._0_4_ = auVar113._4_4_;
            auVar113._8_4_ = auVar113._12_4_;
            auVar79 = pshuflw(auVar145 & auVar79,auVar113,0xe8);
            in_XMM8 = auVar79 & auVar18;
            auVar114._0_4_ = auVar114._4_4_;
            auVar114._8_4_ = auVar114._12_4_;
            auVar18 = pshuflw(auVar18,auVar114,0xe8);
            auVar18 = (auVar18 | in_XMM8) ^ auVar189;
            auVar18 = packssdw(auVar18,auVar18);
            if ((auVar18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(undefined2 *)((long)pvVar17 + lVar14 + 8) = uVar1;
            }
            auVar114 = auVar113 & auVar138 | auVar114;
            auVar18 = packssdw(auVar114,auVar114);
            auVar18 = packssdw(auVar18 ^ auVar189,auVar18 ^ auVar189);
            if ((auVar18 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
              *(undefined2 *)((long)pvVar17 + lVar14 + 10) = uVar1;
            }
            auVar18 = auVar71 ^ auVar81;
            iVar13 = -(uint)(iVar184 < auVar18._0_4_);
            in_XMM6._4_4_ = -(uint)(iVar28 < auVar18._4_4_);
            iVar41 = -(uint)(iVar177 < auVar18._8_4_);
            in_XMM6._12_4_ = -(uint)(iVar183 < auVar18._12_4_);
            auVar115._4_4_ = iVar13;
            auVar115._0_4_ = iVar13;
            auVar115._8_4_ = iVar41;
            auVar115._12_4_ = iVar41;
            auVar139._4_4_ = -(uint)(auVar18._4_4_ == iVar28);
            auVar139._12_4_ = -(uint)(auVar18._12_4_ == iVar183);
            auVar139._0_4_ = auVar139._4_4_;
            auVar139._8_4_ = auVar139._12_4_;
            in_XMM6._0_4_ = in_XMM6._4_4_;
            in_XMM6._8_4_ = in_XMM6._12_4_;
            auVar18 = auVar139 & auVar115 | in_XMM6;
            auVar18 = packssdw(auVar18,auVar18);
            in_XMM7 = packssdw(auVar18 ^ auVar189,auVar18 ^ auVar189);
            if ((in_XMM7 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              *(undefined2 *)((long)pvVar17 + lVar14 + 0xc) = uVar1;
            }
            auVar18 = pshufhw(auVar115,auVar115,0x84);
            auVar145 = pshufhw(auVar139,auVar139,0x84);
            auVar79 = pshufhw(auVar18,in_XMM6,0x84);
            auVar18 = (auVar79 | auVar145 & auVar18) ^ auVar189;
            auVar18 = packssdw(auVar18,auVar18);
            if ((auVar18 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              *(undefined2 *)((long)pvVar17 + lVar14 + 0xe) = uVar1;
            }
            lVar15 = auVar26._8_8_;
            lVar78 = (long)DAT_0055f000;
            auVar26._0_8_ = auVar26._0_8_ + lVar78;
            lVar120 = DAT_0055f000._8_8_;
            auVar26._8_8_ = lVar15 + lVar120;
            lVar15 = auVar38._8_8_;
            auVar38._0_8_ = auVar38._0_8_ + lVar78;
            auVar38._8_8_ = lVar15 + lVar120;
            lVar15 = auVar48._8_8_;
            auVar48._0_8_ = auVar48._0_8_ + lVar78;
            auVar48._8_8_ = lVar15 + lVar120;
            lVar15 = auVar71._8_8_;
            auVar71._0_8_ = auVar71._0_8_ + lVar78;
            auVar71._8_8_ = lVar15 + lVar120;
            lVar14 = lVar14 + 0x10;
            uVar12 = uVar16;
          } while ((ulong)(left + 7U >> 3) << 4 != lVar14);
        }
        iVar13 = (int)uVar11;
        uVar6 = (uint)uVar12;
        if (iVar13 < 0xc) {
          uVar5 = iVar13 + left;
          if ((int)uVar6 < (int)uVar5) {
            do {
              *(undefined2 *)((long)pvVar17 + uVar12 * 2) =
                   *(undefined2 *)((long)local_b0 + (uVar12 * 2 - ((long)left * 2 + lVar10 * 2)));
              uVar12 = uVar12 + 1;
              uVar6 = uVar5;
            } while (uVar5 != uVar12);
          }
        }
        else {
          memcpy((void *)((long)pvVar17 + (long)left * 2),puVar9,(ulong)(uint)(iVar13 * 2));
          auVar189._8_4_ = 0xffffffff;
          auVar189._0_8_ = 0xffffffffffffffff;
          auVar189._12_4_ = 0xffffffff;
          uVar11 = (ulong)(uint)src->w;
          auVar153 = _DAT_0055efe0;
          auVar155 = _DAT_0055eff0;
          auVar169 = _DAT_00553760;
          auVar176 = _DAT_00553770;
          auVar81 = _DAT_005530d0;
          uVar6 = uVar6 + src->w;
        }
        if ((int)uVar6 < (int)uVar2) {
          uVar1 = puVar9[(long)(int)uVar11 + -1];
          lVar15 = lVar7 - (int)uVar6;
          lVar14 = lVar15 + -1;
          auVar27._8_4_ = (int)lVar14;
          auVar27._0_8_ = lVar14;
          auVar27._12_4_ = (int)((ulong)lVar14 >> 0x20);
          lVar14 = (long)(int)uVar6 * 2 + lVar8;
          uVar12 = 0;
          do {
            auVar39._8_4_ = (int)uVar12;
            auVar39._0_8_ = uVar12;
            auVar39._12_4_ = (int)(uVar12 >> 0x20);
            auVar18 = auVar27 ^ auVar81;
            auVar79 = (auVar39 | auVar176) ^ auVar81;
            iVar13 = auVar18._0_4_;
            iVar177 = -(uint)(iVar13 < auVar79._0_4_);
            iVar41 = auVar18._4_4_;
            auVar73._4_4_ = -(uint)(iVar41 < auVar79._4_4_);
            iVar184 = auVar18._8_4_;
            iVar183 = -(uint)(iVar184 < auVar79._8_4_);
            iVar28 = auVar18._12_4_;
            auVar73._12_4_ = -(uint)(iVar28 < auVar79._12_4_);
            auVar116._4_4_ = iVar177;
            auVar116._0_4_ = iVar177;
            auVar116._8_4_ = iVar183;
            auVar116._12_4_ = iVar183;
            auVar18 = pshuflw(in_XMM6,auVar116,0xe8);
            auVar72._4_4_ = -(uint)(auVar79._4_4_ == iVar41);
            auVar72._12_4_ = -(uint)(auVar79._12_4_ == iVar28);
            auVar72._0_4_ = auVar72._4_4_;
            auVar72._8_4_ = auVar72._12_4_;
            auVar145 = pshuflw(in_XMM7,auVar72,0xe8);
            auVar73._0_4_ = auVar73._4_4_;
            auVar73._8_4_ = auVar73._12_4_;
            auVar79 = pshuflw(auVar18,auVar73,0xe8);
            auVar79 = (auVar79 | auVar145 & auVar18) ^ auVar189;
            auVar79 = packssdw(auVar79,auVar79);
            if ((auVar79 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(undefined2 *)(lVar14 + -0xe + uVar12 * 2) = uVar1;
            }
            auVar73 = auVar72 & auVar116 | auVar73;
            auVar79 = packssdw(auVar73,auVar73);
            auVar79 = packssdw(auVar79 ^ auVar189,auVar79 ^ auVar189);
            if ((auVar79._0_4_ >> 0x10 & 1) != 0) {
              *(undefined2 *)(lVar14 + -0xc + uVar12 * 2) = uVar1;
            }
            auVar79 = (auVar39 | auVar169) ^ auVar81;
            iVar177 = -(uint)(iVar13 < auVar79._0_4_);
            auVar140._4_4_ = -(uint)(iVar41 < auVar79._4_4_);
            iVar183 = -(uint)(iVar184 < auVar79._8_4_);
            auVar140._12_4_ = -(uint)(iVar28 < auVar79._12_4_);
            auVar74._4_4_ = iVar177;
            auVar74._0_4_ = iVar177;
            auVar74._8_4_ = iVar183;
            auVar74._12_4_ = iVar183;
            auVar117._4_4_ = -(uint)(auVar79._4_4_ == iVar41);
            auVar117._12_4_ = -(uint)(auVar79._12_4_ == iVar28);
            auVar117._0_4_ = auVar117._4_4_;
            auVar117._8_4_ = auVar117._12_4_;
            auVar140._0_4_ = auVar140._4_4_;
            auVar140._8_4_ = auVar140._12_4_;
            auVar79 = auVar117 & auVar74 | auVar140;
            auVar79 = packssdw(auVar79,auVar79);
            auVar79 = packssdw(auVar79 ^ auVar189,auVar79 ^ auVar189);
            if ((auVar79 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              *(undefined2 *)(lVar14 + -10 + uVar12 * 2) = uVar1;
            }
            auVar146 = pshufhw(auVar74,auVar74,0x84);
            auVar158 = pshufhw(auVar117,auVar117,0x84);
            auVar156 = pshufhw(auVar146,auVar140,0x84);
            auVar146 = (auVar156 | auVar158 & auVar146) ^ auVar189;
            auVar146 = packssdw(auVar146,auVar146);
            if ((auVar146 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              *(undefined2 *)(lVar14 + -8 + uVar12 * 2) = uVar1;
            }
            auVar146 = (auVar39 | auVar155) ^ auVar81;
            iVar177 = -(uint)(iVar13 < auVar146._0_4_);
            auVar76._4_4_ = -(uint)(iVar41 < auVar146._4_4_);
            iVar183 = -(uint)(iVar184 < auVar146._8_4_);
            auVar76._12_4_ = -(uint)(iVar28 < auVar146._12_4_);
            auVar118._4_4_ = iVar177;
            auVar118._0_4_ = iVar177;
            auVar118._8_4_ = iVar183;
            auVar118._12_4_ = iVar183;
            auVar79 = pshuflw(auVar79,auVar118,0xe8);
            auVar75._4_4_ = -(uint)(auVar146._4_4_ == iVar41);
            auVar75._12_4_ = -(uint)(auVar146._12_4_ == iVar28);
            auVar75._0_4_ = auVar75._4_4_;
            auVar75._8_4_ = auVar75._12_4_;
            auVar18 = pshuflw(auVar145 & auVar18,auVar75,0xe8);
            in_XMM7 = auVar18 & auVar79;
            auVar76._0_4_ = auVar76._4_4_;
            auVar76._8_4_ = auVar76._12_4_;
            auVar18 = pshuflw(auVar79,auVar76,0xe8);
            auVar18 = (auVar18 | in_XMM7) ^ auVar189;
            in_XMM6 = packssdw(auVar18,auVar18);
            if ((in_XMM6 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(undefined2 *)(lVar14 + -6 + uVar12 * 2) = uVar1;
            }
            auVar76 = auVar75 & auVar118 | auVar76;
            auVar18 = packssdw(auVar76,auVar76);
            auVar18 = packssdw(auVar18 ^ auVar189,auVar18 ^ auVar189);
            if ((auVar18 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
              *(undefined2 *)(lVar14 + -4 + uVar12 * 2) = uVar1;
            }
            auVar18 = (auVar39 | auVar153) ^ auVar81;
            auVar119._0_4_ = -(uint)(iVar13 < auVar18._0_4_);
            auVar119._4_4_ = -(uint)(iVar41 < auVar18._4_4_);
            auVar119._8_4_ = -(uint)(iVar184 < auVar18._8_4_);
            auVar119._12_4_ = -(uint)(iVar28 < auVar18._12_4_);
            auVar77._4_4_ = auVar119._0_4_;
            auVar77._0_4_ = auVar119._0_4_;
            auVar77._8_4_ = auVar119._8_4_;
            auVar77._12_4_ = auVar119._8_4_;
            auVar40._4_4_ = -(uint)(auVar18._4_4_ == iVar41);
            auVar40._12_4_ = -(uint)(auVar18._12_4_ == iVar28);
            auVar40._0_4_ = auVar40._4_4_;
            auVar40._8_4_ = auVar40._12_4_;
            auVar49._4_4_ = auVar119._4_4_;
            auVar49._0_4_ = auVar119._4_4_;
            auVar49._8_4_ = auVar119._12_4_;
            auVar49._12_4_ = auVar119._12_4_;
            auVar18 = packssdw(auVar119,auVar40 & auVar77 | auVar49);
            auVar18 = packssdw(auVar18 ^ auVar189,auVar18 ^ auVar189);
            if ((auVar18 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              *(undefined2 *)(lVar14 + -2 + uVar12 * 2) = uVar1;
            }
            auVar145 = pshufhw(auVar77,auVar77,0x84);
            auVar18 = pshufhw(auVar40,auVar40,0x84);
            auVar79 = pshufhw(auVar49,auVar49,0x84);
            auVar18 = packssdw(auVar18 & auVar145,(auVar79 | auVar18 & auVar145) ^ auVar189);
            if ((auVar18 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              *(undefined2 *)(lVar14 + uVar12 * 2) = uVar1;
            }
            uVar12 = uVar12 + 8;
          } while ((lVar15 + 7U & 0xfffffffffffffff8) != uVar12);
        }
        pvVar17 = (void *)((long)pvVar17 + lVar7 * 2);
        iVar178 = iVar178 + 1;
        lVar8 = lVar8 + lVar7 * 2;
      } while (iVar178 != iVar3);
    }
  }
  local_b0 = puVar9;
  if (type == 2) {
    iVar178 = src->w;
    local_b0 = local_b0 + iVar178 * top;
    lVar10 = (long)left;
    if (top < 1) {
      iVar13 = 0;
    }
    else {
      iVar41 = 0;
      do {
        uVar11 = 0;
        if (0 < left) {
          puVar9 = local_b0 + lVar10;
          uVar12 = 0;
          do {
            *(undefined2 *)((long)pvVar17 + uVar12 * 2) = *puVar9;
            uVar12 = uVar12 + 1;
            puVar9 = puVar9 + -1;
            uVar11 = uVar16;
          } while (uVar16 != uVar12);
        }
        uVar6 = (uint)uVar11;
        if (iVar178 < 0xc) {
          uVar5 = iVar178 + left;
          if ((int)uVar6 < (int)uVar5) {
            do {
              *(undefined2 *)((long)pvVar17 + uVar11 * 2) = local_b0[uVar11 - lVar10];
              uVar11 = uVar11 + 1;
              uVar6 = uVar5;
            } while (uVar5 != uVar11);
          }
        }
        else {
          memcpy((void *)((long)pvVar17 + lVar10 * 2),local_b0,(ulong)(uint)(iVar178 * 2));
          iVar178 = src->w;
          uVar6 = uVar6 + iVar178;
        }
        if ((int)uVar6 < (int)uVar2) {
          lVar8 = (long)(int)uVar6;
          iVar13 = (left + -2 + iVar178 * 2) - uVar6;
          do {
            *(undefined2 *)((long)pvVar17 + lVar8 * 2) = local_b0[iVar13];
            lVar8 = lVar8 + 1;
            iVar13 = iVar13 + -1;
          } while (lVar7 != lVar8);
        }
        pvVar17 = (void *)((long)pvVar17 + lVar7 * 2);
        local_b0 = local_b0 + -(long)iVar178;
        iVar41 = iVar41 + 1;
        iVar13 = top;
      } while (iVar41 != top);
    }
    if (iVar13 < src->h + top) {
      do {
        uVar11 = 0;
        if (0 < left) {
          puVar9 = local_b0 + lVar10;
          uVar12 = 0;
          do {
            *(undefined2 *)((long)pvVar17 + uVar12 * 2) = *puVar9;
            uVar12 = uVar12 + 1;
            puVar9 = puVar9 + -1;
            uVar11 = uVar16;
          } while (uVar16 != uVar12);
        }
        uVar6 = (uint)uVar11;
        if (iVar178 < 0xc) {
          uVar5 = iVar178 + left;
          if ((int)uVar6 < (int)uVar5) {
            do {
              *(undefined2 *)((long)pvVar17 + uVar11 * 2) = local_b0[uVar11 - lVar10];
              uVar11 = uVar11 + 1;
              uVar6 = uVar5;
            } while (uVar5 != uVar11);
          }
        }
        else {
          memcpy((void *)((long)pvVar17 + lVar10 * 2),local_b0,(ulong)(uint)(iVar178 * 2));
          iVar178 = src->w;
          uVar6 = uVar6 + iVar178;
        }
        if ((int)uVar6 < (int)uVar2) {
          lVar8 = (long)(int)uVar6;
          iVar41 = (left + -2 + iVar178 * 2) - uVar6;
          do {
            *(undefined2 *)((long)pvVar17 + lVar8 * 2) = local_b0[iVar41];
            lVar8 = lVar8 + 1;
            iVar41 = iVar41 + -1;
          } while (lVar7 != lVar8);
        }
        local_b0 = local_b0 + iVar178;
        pvVar17 = (void *)((long)pvVar17 + lVar7 * 2);
        iVar13 = iVar13 + 1;
      } while (iVar13 < src->h + top);
    }
    if (iVar13 < iVar3) {
      local_b0 = local_b0 + -(long)(iVar178 * 2);
      do {
        uVar11 = 0;
        if (0 < left) {
          puVar9 = local_b0 + lVar10;
          uVar12 = 0;
          do {
            *(undefined2 *)((long)pvVar17 + uVar12 * 2) = *puVar9;
            uVar12 = uVar12 + 1;
            puVar9 = puVar9 + -1;
            uVar11 = uVar16;
          } while (uVar16 != uVar12);
        }
        uVar6 = (uint)uVar11;
        if (iVar178 < 0xc) {
          uVar5 = iVar178 + left;
          if ((int)uVar6 < (int)uVar5) {
            do {
              *(undefined2 *)((long)pvVar17 + uVar11 * 2) = local_b0[uVar11 - lVar10];
              uVar11 = uVar11 + 1;
              uVar6 = uVar5;
            } while (uVar5 != uVar11);
          }
        }
        else {
          memcpy((void *)((long)pvVar17 + lVar10 * 2),local_b0,(ulong)(uint)(iVar178 * 2));
          iVar178 = src->w;
          uVar6 = uVar6 + iVar178;
        }
        if ((int)uVar6 < (int)uVar2) {
          lVar8 = (long)(int)uVar6;
          iVar41 = (left + -2 + iVar178 * 2) - uVar6;
          do {
            *(undefined2 *)((long)pvVar17 + lVar8 * 2) = local_b0[iVar41];
            lVar8 = lVar8 + 1;
            iVar41 = iVar41 + -1;
          } while (lVar7 != lVar8);
        }
        pvVar17 = (void *)((long)pvVar17 + lVar7 * 2);
        local_b0 = local_b0 + -(long)iVar178;
        iVar13 = iVar13 + 1;
      } while (iVar13 != iVar3);
    }
  }
  return;
}

Assistant:

static void copy_make_border_image(const Mat& src, Mat& dst, int top, int left, int type, T v)
{
    int w = dst.w;
    int h = dst.h;

    const T* ptr = src;
    T* outptr = dst;

    if (type == 0)
    {
        int y = 0;
        // fill top
        for (; y < top; y++)
        {
            int x = 0;
            for (; x < w; x++)
            {
                outptr[x] = v;
            }
            outptr += w;
        }
        // fill center
        for (; y < (top + src.h); y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = v;
            }
            if (src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = v;
            }
            ptr += src.w;
            outptr += w;
        }
        // fill bottom
        for (; y < h; y++)
        {
            int x = 0;
            for (; x < w; x++)
            {
                outptr[x] = v;
            }
            outptr += w;
        }
    }

    if (type == 1)
    {
        int y = 0;
        // fill top
        for (; y < top; y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = ptr[0];
            }
            if (src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = ptr[src.w - 1];
            }
            outptr += w;
        }
        // fill center
        for (; y < (top + src.h); y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = ptr[0];
            }
            if (src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = ptr[src.w - 1];
            }
            ptr += src.w;
            outptr += w;
        }
        // fill bottom
        ptr -= src.w;
        for (; y < h; y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = ptr[0];
            }
            if (src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = ptr[src.w - 1];
            }
            outptr += w;
        }
    }

    if (type == 2)
    {
        int y = 0;
        // fill top
        ptr += top * src.w;
        for (; y < top; y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = ptr[left - x];
            }
            if (src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = ptr[src.w - (x - left - src.w) - 2];
            }
            outptr += w;
            ptr -= src.w;
        }
        // fill center
        for (; y < (top + src.h); y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = ptr[left - x];
            }
            if (src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = ptr[src.w - (x - left - src.w) - 2];
            }
            ptr += src.w;
            outptr += w;
        }
        // fill bottom
        ptr -= 2 * src.w;
        for (; y < h; y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = ptr[left - x];
            }
            if (src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = ptr[src.w - (x - left - src.w) - 2];
            }
            outptr += w;
            ptr -= src.w;
        }
    }
}